

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  byte bVar32;
  uint uVar33;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float t1;
  undefined4 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vfloat4 b0;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat4 b0_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  vfloat4 a0_3;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  vfloat4 a0_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar199 [16];
  float fVar209;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar213;
  float fVar222;
  float fVar223;
  vfloat4 a0_1;
  undefined1 auVar214 [16];
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  vfloat4 a0;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar34;
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  
  PVar6 = prim[1];
  uVar36 = (ulong)(byte)PVar6;
  fVar123 = *(float *)(prim + uVar36 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar44 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar46 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar36 * 0x19 + 6));
  fVar122 = fVar123 * auVar46._0_4_;
  fVar101 = fVar123 * auVar44._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar36 * 4 + 6);
  auVar72 = vpmovsxbd_avx2(auVar43);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar36 * 5 + 6);
  auVar70 = vpmovsxbd_avx2(auVar51);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar36 * 6 + 6);
  auVar83 = vpmovsxbd_avx2(auVar50);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar36 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar49);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar76 = vpmovsxbd_avx2(auVar52);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vcvtdq2ps_avx(auVar76);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar36 + 6);
  auVar71 = vpmovsxbd_avx2(auVar4);
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar35 = (ulong)(uint)((int)(uVar36 * 9) * 2);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar73 = vpmovsxbd_avx2(auVar48);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar35 + uVar36 + 6);
  auVar74 = vpmovsxbd_avx2(auVar47);
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar28 = (ulong)(uint)((int)(uVar36 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar28 + 6);
  auVar69 = vpmovsxbd_avx2(auVar5);
  auVar75 = vcvtdq2ps_avx(auVar69);
  auVar133._4_4_ = fVar101;
  auVar133._0_4_ = fVar101;
  auVar133._8_4_ = fVar101;
  auVar133._12_4_ = fVar101;
  auVar133._16_4_ = fVar101;
  auVar133._20_4_ = fVar101;
  auVar133._24_4_ = fVar101;
  auVar133._28_4_ = fVar101;
  auVar237._8_4_ = 1;
  auVar237._0_8_ = 0x100000001;
  auVar237._12_4_ = 1;
  auVar237._16_4_ = 1;
  auVar237._20_4_ = 1;
  auVar237._24_4_ = 1;
  auVar237._28_4_ = 1;
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar78 = ZEXT1632(CONCAT412(fVar123 * auVar44._12_4_,
                               CONCAT48(fVar123 * auVar44._8_4_,
                                        CONCAT44(fVar123 * auVar44._4_4_,fVar101))));
  auVar77 = vpermps_avx2(auVar237,auVar78);
  auVar68 = vpermps_avx512vl(auVar67,auVar78);
  fVar101 = auVar68._0_4_;
  fVar198 = auVar68._4_4_;
  auVar78._4_4_ = fVar198 * auVar83._4_4_;
  auVar78._0_4_ = fVar101 * auVar83._0_4_;
  fVar209 = auVar68._8_4_;
  auVar78._8_4_ = fVar209 * auVar83._8_4_;
  fVar211 = auVar68._12_4_;
  auVar78._12_4_ = fVar211 * auVar83._12_4_;
  fVar106 = auVar68._16_4_;
  auVar78._16_4_ = fVar106 * auVar83._16_4_;
  fVar107 = auVar68._20_4_;
  auVar78._20_4_ = fVar107 * auVar83._20_4_;
  fVar108 = auVar68._24_4_;
  auVar78._24_4_ = fVar108 * auVar83._24_4_;
  auVar78._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar71._4_4_ * fVar198;
  auVar76._0_4_ = auVar71._0_4_ * fVar101;
  auVar76._8_4_ = auVar71._8_4_ * fVar209;
  auVar76._12_4_ = auVar71._12_4_ * fVar211;
  auVar76._16_4_ = auVar71._16_4_ * fVar106;
  auVar76._20_4_ = auVar71._20_4_ * fVar107;
  auVar76._24_4_ = auVar71._24_4_ * fVar108;
  auVar76._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar75._4_4_ * fVar198;
  auVar69._0_4_ = auVar75._0_4_ * fVar101;
  auVar69._8_4_ = auVar75._8_4_ * fVar209;
  auVar69._12_4_ = auVar75._12_4_ * fVar211;
  auVar69._16_4_ = auVar75._16_4_ * fVar106;
  auVar69._20_4_ = auVar75._20_4_ * fVar107;
  auVar69._24_4_ = auVar75._24_4_ * fVar108;
  auVar69._28_4_ = auVar68._28_4_;
  auVar43 = vfmadd231ps_fma(auVar78,auVar77,auVar70);
  auVar51 = vfmadd231ps_fma(auVar76,auVar77,auVar85);
  auVar50 = vfmadd231ps_fma(auVar69,auVar74,auVar77);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar133,auVar72);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar133,auVar84);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar73,auVar133);
  auVar145._4_4_ = fVar122;
  auVar145._0_4_ = fVar122;
  auVar145._8_4_ = fVar122;
  auVar145._12_4_ = fVar122;
  auVar145._16_4_ = fVar122;
  auVar145._20_4_ = fVar122;
  auVar145._24_4_ = fVar122;
  auVar145._28_4_ = fVar122;
  auVar69 = ZEXT1632(CONCAT412(fVar123 * auVar46._12_4_,
                               CONCAT48(fVar123 * auVar46._8_4_,
                                        CONCAT44(fVar123 * auVar46._4_4_,fVar122))));
  auVar76 = vpermps_avx2(auVar237,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  fVar123 = auVar69._0_4_;
  fVar101 = auVar69._4_4_;
  auVar77._4_4_ = fVar101 * auVar83._4_4_;
  auVar77._0_4_ = fVar123 * auVar83._0_4_;
  fVar198 = auVar69._8_4_;
  auVar77._8_4_ = fVar198 * auVar83._8_4_;
  fVar209 = auVar69._12_4_;
  auVar77._12_4_ = fVar209 * auVar83._12_4_;
  fVar211 = auVar69._16_4_;
  auVar77._16_4_ = fVar211 * auVar83._16_4_;
  fVar106 = auVar69._20_4_;
  auVar77._20_4_ = fVar106 * auVar83._20_4_;
  fVar107 = auVar69._24_4_;
  auVar77._24_4_ = fVar107 * auVar83._24_4_;
  auVar77._28_4_ = 1;
  auVar67._4_4_ = auVar71._4_4_ * fVar101;
  auVar67._0_4_ = auVar71._0_4_ * fVar123;
  auVar67._8_4_ = auVar71._8_4_ * fVar198;
  auVar67._12_4_ = auVar71._12_4_ * fVar209;
  auVar67._16_4_ = auVar71._16_4_ * fVar211;
  auVar67._20_4_ = auVar71._20_4_ * fVar106;
  auVar67._24_4_ = auVar71._24_4_ * fVar107;
  auVar67._28_4_ = auVar83._28_4_;
  auVar71._4_4_ = auVar75._4_4_ * fVar101;
  auVar71._0_4_ = auVar75._0_4_ * fVar123;
  auVar71._8_4_ = auVar75._8_4_ * fVar198;
  auVar71._12_4_ = auVar75._12_4_ * fVar209;
  auVar71._16_4_ = auVar75._16_4_ * fVar211;
  auVar71._20_4_ = auVar75._20_4_ * fVar106;
  auVar71._24_4_ = auVar75._24_4_ * fVar107;
  auVar71._28_4_ = auVar69._28_4_;
  auVar49 = vfmadd231ps_fma(auVar77,auVar76,auVar70);
  auVar52 = vfmadd231ps_fma(auVar67,auVar76,auVar85);
  auVar4 = vfmadd231ps_fma(auVar71,auVar76,auVar74);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar145,auVar72);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar145,auVar84);
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar145,auVar73);
  auVar72 = vandps_avx(ZEXT1632(auVar43),auVar86);
  auVar88._8_4_ = 0x219392ef;
  auVar88._0_8_ = 0x219392ef219392ef;
  auVar88._12_4_ = 0x219392ef;
  auVar88._16_4_ = 0x219392ef;
  auVar88._20_4_ = 0x219392ef;
  auVar88._24_4_ = 0x219392ef;
  auVar88._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar72,auVar88,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar68._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar51),auVar86);
  uVar35 = vcmpps_avx512vl(auVar72,auVar88,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar79._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar50),auVar86);
  uVar35 = vcmpps_avx512vl(auVar72,auVar88,1);
  bVar38 = (bool)((byte)uVar35 & 1);
  auVar72._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._0_4_;
  bVar38 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._4_4_;
  bVar38 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._8_4_;
  bVar38 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = 0x3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar87._16_4_ = 0x3f800000;
  auVar87._20_4_ = 0x3f800000;
  auVar87._24_4_ = 0x3f800000;
  auVar87._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar68,auVar70,auVar87);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar79);
  auVar51 = vfnmadd213ps_fma(auVar79,auVar70,auVar87);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar72);
  auVar50 = vfnmadd213ps_fma(auVar72,auVar70,auVar87);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar70,auVar70);
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 7 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar49));
  auVar73._4_4_ = auVar43._4_4_ * auVar72._4_4_;
  auVar73._0_4_ = auVar43._0_4_ * auVar72._0_4_;
  auVar73._8_4_ = auVar43._8_4_ * auVar72._8_4_;
  auVar73._12_4_ = auVar43._12_4_ * auVar72._12_4_;
  auVar73._16_4_ = auVar72._16_4_ * 0.0;
  auVar73._20_4_ = auVar72._20_4_ * 0.0;
  auVar73._24_4_ = auVar72._24_4_ * 0.0;
  auVar73._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 9 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar49));
  auVar71 = vpbroadcastd_avx512vl();
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar82._0_4_ = auVar43._0_4_ * auVar72._0_4_;
  auVar82._4_4_ = auVar43._4_4_ * auVar72._4_4_;
  auVar82._8_4_ = auVar43._8_4_ * auVar72._8_4_;
  auVar82._12_4_ = auVar43._12_4_ * auVar72._12_4_;
  auVar82._16_4_ = auVar72._16_4_ * 0.0;
  auVar82._20_4_ = auVar72._20_4_ * 0.0;
  auVar82._24_4_ = auVar72._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar36 * -2 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar52));
  auVar74._4_4_ = auVar51._4_4_ * auVar72._4_4_;
  auVar74._0_4_ = auVar51._0_4_ * auVar72._0_4_;
  auVar74._8_4_ = auVar51._8_4_ * auVar72._8_4_;
  auVar74._12_4_ = auVar51._12_4_ * auVar72._12_4_;
  auVar74._16_4_ = auVar72._16_4_ * 0.0;
  auVar74._20_4_ = auVar72._20_4_ * 0.0;
  auVar74._24_4_ = auVar72._24_4_ * 0.0;
  auVar74._28_4_ = auVar72._28_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar52));
  auVar81._0_4_ = auVar51._0_4_ * auVar72._0_4_;
  auVar81._4_4_ = auVar51._4_4_ * auVar72._4_4_;
  auVar81._8_4_ = auVar51._8_4_ * auVar72._8_4_;
  auVar81._12_4_ = auVar51._12_4_ * auVar72._12_4_;
  auVar81._16_4_ = auVar72._16_4_ * 0.0;
  auVar81._20_4_ = auVar72._20_4_ * 0.0;
  auVar81._24_4_ = auVar72._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 + uVar36 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar4));
  auVar75._4_4_ = auVar72._4_4_ * auVar50._4_4_;
  auVar75._0_4_ = auVar72._0_4_ * auVar50._0_4_;
  auVar75._8_4_ = auVar72._8_4_ * auVar50._8_4_;
  auVar75._12_4_ = auVar72._12_4_ * auVar50._12_4_;
  auVar75._16_4_ = auVar72._16_4_ * 0.0;
  auVar75._20_4_ = auVar72._20_4_ * 0.0;
  auVar75._24_4_ = auVar72._24_4_ * 0.0;
  auVar75._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 * 0x17 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar4));
  auVar80._0_4_ = auVar50._0_4_ * auVar72._0_4_;
  auVar80._4_4_ = auVar50._4_4_ * auVar72._4_4_;
  auVar80._8_4_ = auVar50._8_4_ * auVar72._8_4_;
  auVar80._12_4_ = auVar50._12_4_ * auVar72._12_4_;
  auVar80._16_4_ = auVar72._16_4_ * 0.0;
  auVar80._20_4_ = auVar72._20_4_ * 0.0;
  auVar80._24_4_ = auVar72._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar72 = vpminsd_avx2(auVar73,auVar82);
  auVar70 = vpminsd_avx2(auVar74,auVar81);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx2(auVar75,auVar80);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar83._4_4_ = uVar109;
  auVar83._0_4_ = uVar109;
  auVar83._8_4_ = uVar109;
  auVar83._12_4_ = uVar109;
  auVar83._16_4_ = uVar109;
  auVar83._20_4_ = uVar109;
  auVar83._24_4_ = uVar109;
  auVar83._28_4_ = uVar109;
  auVar70 = vmaxps_avx512vl(auVar70,auVar83);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  auVar70._16_4_ = 0x3f7ffffa;
  auVar70._20_4_ = 0x3f7ffffa;
  auVar70._24_4_ = 0x3f7ffffa;
  auVar70._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar72,auVar70);
  auVar72 = vpmaxsd_avx2(auVar73,auVar82);
  auVar70 = vpmaxsd_avx2(auVar74,auVar81);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx2(auVar75,auVar80);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar84._4_4_ = uVar109;
  auVar84._0_4_ = uVar109;
  auVar84._8_4_ = uVar109;
  auVar84._12_4_ = uVar109;
  auVar84._16_4_ = uVar109;
  auVar84._20_4_ = uVar109;
  auVar84._24_4_ = uVar109;
  auVar84._28_4_ = uVar109;
  auVar70 = vminps_avx512vl(auVar70,auVar84);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar85);
  uVar17 = vpcmpgtd_avx512vl(auVar71,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_1c0,auVar72,2);
  if ((byte)((byte)uVar16 & (byte)uVar17) == 0) {
    return false;
  }
  uVar35 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar238 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar43);
  auVar247 = ZEXT464(0x3f800000);
  auVar43 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar246 = ZEXT1664(auVar43);
LAB_01c986ca:
  lVar31 = 0;
  for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar37 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar37].ptr;
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar31 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar43 = *(undefined1 (*) [16])(_Var11 + uVar28 * (long)pvVar10);
  auVar51 = *(undefined1 (*) [16])(_Var11 + (uVar28 + 1) * (long)pvVar10);
  auVar50 = *(undefined1 (*) [16])(_Var11 + (uVar28 + 2) * (long)pvVar10);
  auVar49 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar28 + 3));
  lVar31 = *(long *)&pGVar8[1].time_range.upper;
  auVar52 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * uVar28);
  auVar4 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar28 + 1));
  auVar48 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar28 + 2));
  uVar35 = uVar35 - 1 & uVar35;
  auVar47 = *(undefined1 (*) [16])(lVar31 + (long)p_Var9 * (uVar28 + 3));
  if (uVar35 != 0) {
    uVar36 = uVar35 - 1 & uVar35;
    for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    }
    if (uVar36 != 0) {
      for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar53 = ZEXT816(0) << 0x40;
  auVar46._0_4_ = auVar47._0_4_ * 0.0;
  auVar46._4_4_ = auVar47._4_4_ * 0.0;
  auVar46._8_4_ = auVar47._8_4_ * 0.0;
  auVar46._12_4_ = auVar47._12_4_ * 0.0;
  auVar46 = vfmadd231ps_fma(auVar46,auVar48,auVar53);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar46);
  auVar113._0_4_ = auVar52._0_4_ + auVar44._0_4_;
  auVar113._4_4_ = auVar52._4_4_ + auVar44._4_4_;
  auVar113._8_4_ = auVar52._8_4_ + auVar44._8_4_;
  auVar113._12_4_ = auVar52._12_4_ + auVar44._12_4_;
  auVar110 = auVar238._0_16_;
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar4,auVar110);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar52,auVar110);
  auVar214._0_4_ = auVar49._0_4_ * 0.0;
  auVar214._4_4_ = auVar49._4_4_ * 0.0;
  auVar214._8_4_ = auVar49._8_4_ * 0.0;
  auVar214._12_4_ = auVar49._12_4_ * 0.0;
  auVar46 = vfmadd231ps_fma(auVar214,auVar50,auVar53);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar51,auVar46);
  auVar225._0_4_ = auVar43._0_4_ + auVar44._0_4_;
  auVar225._4_4_ = auVar43._4_4_ + auVar44._4_4_;
  auVar225._8_4_ = auVar43._8_4_ + auVar44._8_4_;
  auVar225._12_4_ = auVar43._12_4_ + auVar44._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar110);
  auVar46 = vfnmadd231ps_avx512vl(auVar44,auVar43,auVar110);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar47);
  auVar44 = vfmadd231ps_fma(auVar44,auVar4,auVar53);
  auVar44 = vfmadd231ps_fma(auVar44,auVar52,auVar53);
  auVar47 = vmulps_avx512vl(auVar47,auVar110);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar110,auVar48);
  auVar4 = vfmadd231ps_fma(auVar48,auVar53,auVar4);
  auVar48 = vfnmadd231ps_fma(auVar4,auVar53,auVar52);
  auVar52 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar49);
  auVar52 = vfmadd231ps_fma(auVar52,auVar51,auVar53);
  auVar52 = vfmadd231ps_fma(auVar52,auVar43,auVar53);
  auVar49 = vmulps_avx512vl(auVar49,auVar110);
  auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar110,auVar50);
  auVar51 = vfmadd231ps_fma(auVar50,auVar53,auVar51);
  auVar4 = vfnmadd231ps_fma(auVar51,auVar53,auVar43);
  auVar43 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar51 = vshufps_avx(auVar225,auVar225,0xc9);
  fVar211 = auVar45._0_4_;
  auVar149._0_4_ = fVar211 * auVar51._0_4_;
  fVar106 = auVar45._4_4_;
  auVar149._4_4_ = fVar106 * auVar51._4_4_;
  fVar107 = auVar45._8_4_;
  auVar149._8_4_ = fVar107 * auVar51._8_4_;
  fVar108 = auVar45._12_4_;
  auVar149._12_4_ = fVar108 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar149,auVar43,auVar225);
  auVar50 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar56._0_4_ = fVar211 * auVar51._0_4_;
  auVar56._4_4_ = fVar106 * auVar51._4_4_;
  auVar56._8_4_ = fVar107 * auVar51._8_4_;
  auVar56._12_4_ = fVar108 * auVar51._12_4_;
  auVar43 = vfmsub231ps_fma(auVar56,auVar43,auVar46);
  auVar49 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar122 = auVar48._0_4_;
  auVar60._0_4_ = fVar122 * auVar51._0_4_;
  fVar136 = auVar48._4_4_;
  auVar60._4_4_ = fVar136 * auVar51._4_4_;
  fVar137 = auVar48._8_4_;
  auVar60._8_4_ = fVar137 * auVar51._8_4_;
  fVar138 = auVar48._12_4_;
  auVar60._12_4_ = fVar138 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar60,auVar43,auVar52);
  auVar52 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar178._0_4_ = auVar51._0_4_ * fVar122;
  auVar178._4_4_ = auVar51._4_4_ * fVar136;
  auVar178._8_4_ = auVar51._8_4_ * fVar137;
  auVar178._12_4_ = auVar51._12_4_ * fVar138;
  auVar43 = vfmsub231ps_fma(auVar178,auVar43,auVar4);
  auVar4 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar50,auVar50,0x7f);
  fVar123 = auVar43._0_4_;
  auVar179._4_12_ = ZEXT812(0) << 0x20;
  auVar179._0_4_ = fVar123;
  auVar51 = vrsqrt14ss_avx512f(auVar53,auVar179);
  auVar47 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar101 = auVar51._0_4_;
  fVar198 = auVar47._0_4_ - auVar46._0_4_ * fVar101 * fVar101 * fVar101;
  fVar213 = fVar198 * auVar50._0_4_;
  fVar222 = fVar198 * auVar50._4_4_;
  fVar223 = fVar198 * auVar50._8_4_;
  fVar224 = fVar198 * auVar50._12_4_;
  auVar51 = vdpps_avx(auVar50,auVar49,0x7f);
  auVar190._0_4_ = auVar49._0_4_ * fVar123;
  auVar190._4_4_ = auVar49._4_4_ * fVar123;
  auVar190._8_4_ = auVar49._8_4_ * fVar123;
  auVar190._12_4_ = auVar49._12_4_ * fVar123;
  fVar123 = auVar51._0_4_;
  auVar157._0_4_ = fVar123 * auVar50._0_4_;
  auVar157._4_4_ = fVar123 * auVar50._4_4_;
  auVar157._8_4_ = fVar123 * auVar50._8_4_;
  auVar157._12_4_ = fVar123 * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar190,auVar157);
  auVar51 = vrcp14ss_avx512f(auVar53,auVar179);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar123 = auVar51._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar101 = auVar43._0_4_;
  auVar171._4_12_ = ZEXT812(0) << 0x20;
  auVar171._0_4_ = fVar101;
  auVar51 = vrsqrt14ss_avx512f(auVar53,auVar171);
  auVar49 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar209 = auVar51._0_4_;
  fVar209 = auVar49._0_4_ - auVar47._0_4_ * fVar209 * fVar209 * fVar209;
  fVar197 = fVar209 * auVar52._0_4_;
  fVar208 = fVar209 * auVar52._4_4_;
  fVar210 = fVar209 * auVar52._8_4_;
  fVar212 = fVar209 * auVar52._12_4_;
  auVar51 = vdpps_avx(auVar52,auVar4,0x7f);
  auVar57._0_4_ = fVar101 * auVar4._0_4_;
  auVar57._4_4_ = fVar101 * auVar4._4_4_;
  auVar57._8_4_ = fVar101 * auVar4._8_4_;
  auVar57._12_4_ = fVar101 * auVar4._12_4_;
  fVar101 = auVar51._0_4_;
  auVar61._0_4_ = fVar101 * auVar52._0_4_;
  auVar61._4_4_ = fVar101 * auVar52._4_4_;
  auVar61._8_4_ = fVar101 * auVar52._8_4_;
  auVar61._12_4_ = fVar101 * auVar52._12_4_;
  auVar49 = vsubps_avx(auVar57,auVar61);
  auVar51 = vrcp14ss_avx512f(auVar53,auVar171);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar101 = auVar43._0_4_ * auVar51._0_4_;
  auVar43 = vshufps_avx(auVar113,auVar113,0xff);
  auVar172._0_4_ = fVar213 * auVar43._0_4_;
  auVar172._4_4_ = fVar222 * auVar43._4_4_;
  auVar172._8_4_ = fVar223 * auVar43._8_4_;
  auVar172._12_4_ = fVar224 * auVar43._12_4_;
  local_310 = vsubps_avx(auVar113,auVar172);
  auVar51 = vshufps_avx(auVar45,auVar45,0xff);
  auVar64._0_4_ = auVar51._0_4_ * fVar213 + auVar43._0_4_ * fVar198 * fVar123 * auVar50._0_4_;
  auVar64._4_4_ = auVar51._4_4_ * fVar222 + auVar43._4_4_ * fVar198 * fVar123 * auVar50._4_4_;
  auVar64._8_4_ = auVar51._8_4_ * fVar223 + auVar43._8_4_ * fVar198 * fVar123 * auVar50._8_4_;
  auVar64._12_4_ = auVar51._12_4_ * fVar224 + auVar43._12_4_ * fVar198 * fVar123 * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar45,auVar64);
  local_320._0_4_ = auVar172._0_4_ + auVar113._0_4_;
  local_320._4_4_ = auVar172._4_4_ + auVar113._4_4_;
  fStack_318 = auVar172._8_4_ + auVar113._8_4_;
  fStack_314 = auVar172._12_4_ + auVar113._12_4_;
  auVar43 = vshufps_avx(auVar44,auVar44,0xff);
  auVar65._0_4_ = fVar197 * auVar43._0_4_;
  auVar65._4_4_ = fVar208 * auVar43._4_4_;
  auVar65._8_4_ = fVar210 * auVar43._8_4_;
  auVar65._12_4_ = fVar212 * auVar43._12_4_;
  local_330 = vsubps_avx(auVar44,auVar65);
  auVar51 = vshufps_avx(auVar48,auVar48,0xff);
  auVar114._0_4_ = auVar51._0_4_ * fVar197 + auVar43._0_4_ * fVar209 * auVar49._0_4_ * fVar101;
  auVar114._4_4_ = auVar51._4_4_ * fVar208 + auVar43._4_4_ * fVar209 * auVar49._4_4_ * fVar101;
  auVar114._8_4_ = auVar51._8_4_ * fVar210 + auVar43._8_4_ * fVar209 * auVar49._8_4_ * fVar101;
  auVar114._12_4_ = auVar51._12_4_ * fVar212 + auVar43._12_4_ * fVar209 * auVar49._12_4_ * fVar101;
  auVar43 = vsubps_avx(auVar48,auVar114);
  _local_340 = vaddps_avx512vl(auVar44,auVar65);
  auVar66._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar66._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar66._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar66._12_4_ = auVar50._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar66);
  auVar58._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar58._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar58._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar58._12_4_ = auVar43._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar58);
  auVar45._0_4_ = (fVar211 + auVar64._0_4_) * 0.33333334;
  auVar45._4_4_ = (fVar106 + auVar64._4_4_) * 0.33333334;
  auVar45._8_4_ = (fVar107 + auVar64._8_4_) * 0.33333334;
  auVar45._12_4_ = (fVar108 + auVar64._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar45);
  auVar53._0_4_ = (fVar122 + auVar114._0_4_) * 0.33333334;
  auVar53._4_4_ = (fVar136 + auVar114._4_4_) * 0.33333334;
  auVar53._8_4_ = (fVar137 + auVar114._8_4_) * 0.33333334;
  auVar53._12_4_ = (fVar138 + auVar114._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar53);
  local_290 = vsubps_avx(local_310,auVar5);
  uVar109 = local_290._0_4_;
  auVar55._4_4_ = uVar109;
  auVar55._0_4_ = uVar109;
  auVar55._8_4_ = uVar109;
  auVar55._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_290,local_290,0x55);
  auVar51 = vshufps_avx(local_290,local_290,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar123 = pre->ray_space[k].vz.field_0.m128[0];
  fVar101 = pre->ray_space[k].vz.field_0.m128[1];
  fVar198 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar110._0_4_ = fVar123 * auVar51._0_4_;
  auVar110._4_4_ = fVar101 * auVar51._4_4_;
  auVar110._8_4_ = fVar198 * auVar51._8_4_;
  auVar110._12_4_ = fVar209 * auVar51._12_4_;
  auVar43 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar3,auVar43);
  auVar44 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar55);
  local_2a0 = vsubps_avx512vl(local_350,auVar5);
  uVar109 = local_2a0._0_4_;
  auVar59._4_4_ = uVar109;
  auVar59._0_4_ = uVar109;
  auVar59._8_4_ = uVar109;
  auVar59._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar51 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar63._0_4_ = fVar123 * auVar51._0_4_;
  auVar63._4_4_ = fVar101 * auVar51._4_4_;
  auVar63._8_4_ = fVar198 * auVar51._8_4_;
  auVar63._12_4_ = fVar209 * auVar51._12_4_;
  auVar43 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar3,auVar43);
  auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar59);
  local_2b0 = vsubps_avx512vl(local_360,auVar5);
  uVar109 = local_2b0._0_4_;
  auVar158._4_4_ = uVar109;
  auVar158._0_4_ = uVar109;
  auVar158._8_4_ = uVar109;
  auVar158._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar51 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar62._0_4_ = fVar123 * auVar51._0_4_;
  auVar62._4_4_ = fVar101 * auVar51._4_4_;
  auVar62._8_4_ = fVar198 * auVar51._8_4_;
  auVar62._12_4_ = fVar209 * auVar51._12_4_;
  auVar43 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar43);
  auVar45 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar158);
  local_2c0 = vsubps_avx(local_330,auVar5);
  uVar109 = local_2c0._0_4_;
  auVar159._4_4_ = uVar109;
  auVar159._0_4_ = uVar109;
  auVar159._8_4_ = uVar109;
  auVar159._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar51 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar180._0_4_ = auVar51._0_4_ * fVar123;
  auVar180._4_4_ = auVar51._4_4_ * fVar101;
  auVar180._8_4_ = auVar51._8_4_ * fVar198;
  auVar180._12_4_ = auVar51._12_4_ * fVar209;
  auVar43 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar3,auVar43);
  auVar53 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar159);
  local_2d0 = vsubps_avx(_local_320,auVar5);
  uVar109 = local_2d0._0_4_;
  auVar160._4_4_ = uVar109;
  auVar160._0_4_ = uVar109;
  auVar160._8_4_ = uVar109;
  auVar160._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar51 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar191._0_4_ = auVar51._0_4_ * fVar123;
  auVar191._4_4_ = auVar51._4_4_ * fVar101;
  auVar191._8_4_ = auVar51._8_4_ * fVar198;
  auVar191._12_4_ = auVar51._12_4_ * fVar209;
  auVar43 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar3,auVar43);
  auVar110 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar160);
  local_2e0 = vsubps_avx512vl(_local_370,auVar5);
  uVar109 = local_2e0._0_4_;
  auVar161._4_4_ = uVar109;
  auVar161._0_4_ = uVar109;
  auVar161._8_4_ = uVar109;
  auVar161._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar51 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar199._0_4_ = auVar51._0_4_ * fVar123;
  auVar199._4_4_ = auVar51._4_4_ * fVar101;
  auVar199._8_4_ = auVar51._8_4_ * fVar198;
  auVar199._12_4_ = auVar51._12_4_ * fVar209;
  auVar43 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar3,auVar43);
  auVar113 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar161);
  local_2f0 = vsubps_avx512vl(_local_380,auVar5);
  uVar109 = local_2f0._0_4_;
  auVar162._4_4_ = uVar109;
  auVar162._0_4_ = uVar109;
  auVar162._8_4_ = uVar109;
  auVar162._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar51 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar215._0_4_ = auVar51._0_4_ * fVar123;
  auVar215._4_4_ = auVar51._4_4_ * fVar101;
  auVar215._8_4_ = auVar51._8_4_ * fVar198;
  auVar215._12_4_ = auVar51._12_4_ * fVar209;
  auVar43 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar3,auVar43);
  auVar114 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar162);
  local_300 = vsubps_avx512vl(_local_340,auVar5);
  uVar109 = local_300._0_4_;
  auVar54._4_4_ = uVar109;
  auVar54._0_4_ = uVar109;
  auVar54._8_4_ = uVar109;
  auVar54._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_300,local_300,0x55);
  auVar51 = vshufps_avx(local_300,local_300,0xaa);
  auVar150._0_4_ = auVar51._0_4_ * fVar123;
  auVar150._4_4_ = auVar51._4_4_ * fVar101;
  auVar150._8_4_ = auVar51._8_4_ * fVar198;
  auVar150._12_4_ = auVar51._12_4_ * fVar209;
  auVar43 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar43);
  auVar5 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar54);
  auVar50 = vmovlhps_avx(auVar44,auVar110);
  auVar4 = vmovlhps_avx512f(auVar46,auVar113);
  auVar48 = vmovlhps_avx512f(auVar45,auVar114);
  auVar47 = vmovlhps_avx512f(auVar53,auVar5);
  auVar43 = vminps_avx512vl(auVar50,auVar4);
  auVar49 = vmaxps_avx512vl(auVar50,auVar4);
  auVar51 = vminps_avx512vl(auVar48,auVar47);
  auVar51 = vminps_avx(auVar43,auVar51);
  auVar43 = vmaxps_avx512vl(auVar48,auVar47);
  auVar43 = vmaxps_avx(auVar49,auVar43);
  auVar49 = vshufpd_avx(auVar51,auVar51,3);
  auVar52 = vshufpd_avx(auVar43,auVar43,3);
  auVar51 = vminps_avx(auVar51,auVar49);
  auVar43 = vmaxps_avx(auVar43,auVar52);
  auVar51 = vandps_avx512vl(auVar51,auVar239._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar239._0_16_);
  auVar43 = vmaxps_avx(auVar51,auVar43);
  auVar51 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar51,auVar43);
  fVar123 = auVar43._0_4_ * 9.536743e-07;
  auVar163._8_8_ = auVar44._0_8_;
  auVar163._0_8_ = auVar44._0_8_;
  auVar51 = vmovddup_avx512vl(auVar46);
  auVar49 = vmovddup_avx512vl(auVar45);
  auVar111._8_8_ = auVar53._0_8_;
  auVar111._0_8_ = auVar53._0_8_;
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar123));
  auVar43 = vxorps_avx512vl(local_260._0_16_,auVar240._0_16_);
  auVar72 = vbroadcastss_avx512vl(auVar43);
  local_1e0 = vpbroadcastd_avx512vl();
  bVar38 = false;
  uVar28 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar52 = vsubps_avx512vl(auVar4,auVar50);
  local_270 = vsubps_avx512vl(auVar48,auVar4);
  local_280 = vsubps_avx512vl(auVar47,auVar48);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_200 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar44 = auVar43;
LAB_01c98e29:
  do {
    auVar46 = vshufps_avx(auVar44,auVar44,0x50);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar53 = vsubps_avx512vl(auVar73._0_16_,auVar46);
    fVar101 = auVar46._0_4_;
    fVar106 = auVar110._0_4_;
    auVar130._0_4_ = fVar106 * fVar101;
    fVar198 = auVar46._4_4_;
    fVar107 = auVar110._4_4_;
    auVar130._4_4_ = fVar107 * fVar198;
    fVar209 = auVar46._8_4_;
    auVar130._8_4_ = fVar106 * fVar209;
    fVar211 = auVar46._12_4_;
    auVar130._12_4_ = fVar107 * fVar211;
    fVar108 = auVar113._0_4_;
    auVar139._0_4_ = fVar108 * fVar101;
    fVar122 = auVar113._4_4_;
    auVar139._4_4_ = fVar122 * fVar198;
    auVar139._8_4_ = fVar108 * fVar209;
    auVar139._12_4_ = fVar122 * fVar211;
    fVar136 = auVar114._0_4_;
    auVar151._0_4_ = fVar136 * fVar101;
    fVar137 = auVar114._4_4_;
    auVar151._4_4_ = fVar137 * fVar198;
    auVar151._8_4_ = fVar136 * fVar209;
    auVar151._12_4_ = fVar137 * fVar211;
    fVar138 = auVar5._0_4_;
    auVar115._0_4_ = fVar138 * fVar101;
    fVar197 = auVar5._4_4_;
    auVar115._4_4_ = fVar197 * fVar198;
    auVar115._8_4_ = fVar138 * fVar209;
    auVar115._12_4_ = fVar197 * fVar211;
    auVar45 = vfmadd231ps_fma(auVar130,auVar53,auVar163);
    auVar54 = vfmadd231ps_avx512vl(auVar139,auVar53,auVar51);
    auVar55 = vfmadd231ps_avx512vl(auVar151,auVar53,auVar49);
    auVar53 = vfmadd231ps_fma(auVar115,auVar111,auVar53);
    auVar46 = vmovshdup_avx(auVar43);
    fVar198 = auVar43._0_4_;
    fVar101 = (auVar46._0_4_ - fVar198) * 0.04761905;
    auVar177._4_4_ = fVar198;
    auVar177._0_4_ = fVar198;
    auVar177._8_4_ = fVar198;
    auVar177._12_4_ = fVar198;
    auVar177._16_4_ = fVar198;
    auVar177._20_4_ = fVar198;
    auVar177._24_4_ = fVar198;
    auVar177._28_4_ = fVar198;
    auVar128._0_8_ = auVar46._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar70 = vsubps_avx(auVar128,auVar177);
    uVar109 = auVar45._0_4_;
    auVar129._4_4_ = uVar109;
    auVar129._0_4_ = uVar109;
    auVar129._8_4_ = uVar109;
    auVar129._12_4_ = uVar109;
    auVar129._16_4_ = uVar109;
    auVar129._20_4_ = uVar109;
    auVar129._24_4_ = uVar109;
    auVar129._28_4_ = uVar109;
    auVar194._8_4_ = 1;
    auVar194._0_8_ = 0x100000001;
    auVar194._12_4_ = 1;
    auVar194._16_4_ = 1;
    auVar194._20_4_ = 1;
    auVar194._24_4_ = 1;
    auVar194._28_4_ = 1;
    auVar84 = ZEXT1632(auVar45);
    auVar83 = vpermps_avx2(auVar194,auVar84);
    auVar74 = vbroadcastss_avx512vl(auVar54);
    auVar85 = ZEXT1632(auVar54);
    auVar75 = vpermps_avx512vl(auVar194,auVar85);
    auVar76 = vbroadcastss_avx512vl(auVar55);
    auVar71 = ZEXT1632(auVar55);
    auVar69 = vpermps_avx512vl(auVar194,auVar71);
    auVar77 = vbroadcastss_avx512vl(auVar53);
    auVar81 = ZEXT1632(auVar53);
    auVar78 = vpermps_avx512vl(auVar194,auVar81);
    auVar195._4_4_ = fVar101;
    auVar195._0_4_ = fVar101;
    auVar195._8_4_ = fVar101;
    auVar195._12_4_ = fVar101;
    auVar195._16_4_ = fVar101;
    auVar195._20_4_ = fVar101;
    auVar195._24_4_ = fVar101;
    auVar195._28_4_ = fVar101;
    auVar231._8_4_ = 2;
    auVar231._0_8_ = 0x200000002;
    auVar231._12_4_ = 2;
    auVar231._16_4_ = 2;
    auVar231._20_4_ = 2;
    auVar231._24_4_ = 2;
    auVar231._28_4_ = 2;
    auVar67 = vpermps_avx512vl(auVar231,auVar84);
    auVar170._8_4_ = 3;
    auVar170._0_8_ = 0x300000003;
    auVar170._12_4_ = 3;
    auVar170._16_4_ = 3;
    auVar170._20_4_ = 3;
    auVar170._24_4_ = 3;
    auVar170._28_4_ = 3;
    auVar68 = vpermps_avx512vl(auVar170,auVar84);
    auVar79 = vpermps_avx512vl(auVar231,auVar85);
    auVar84 = vpermps_avx2(auVar170,auVar85);
    auVar85 = vpermps_avx2(auVar231,auVar71);
    auVar71 = vpermps_avx2(auVar170,auVar71);
    auVar80 = vpermps_avx512vl(auVar231,auVar81);
    auVar81 = vpermps_avx512vl(auVar170,auVar81);
    auVar46 = vfmadd132ps_fma(auVar70,auVar177,_DAT_01faff20);
    auVar73 = vsubps_avx512vl(auVar73,ZEXT1632(auVar46));
    auVar70 = vmulps_avx512vl(auVar74,ZEXT1632(auVar46));
    auVar86 = ZEXT1632(auVar46);
    auVar82 = vmulps_avx512vl(auVar75,auVar86);
    auVar45 = vfmadd231ps_fma(auVar70,auVar73,auVar129);
    auVar53 = vfmadd231ps_fma(auVar82,auVar73,auVar83);
    auVar70 = vmulps_avx512vl(auVar76,auVar86);
    auVar82 = vmulps_avx512vl(auVar69,auVar86);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar73,auVar74);
    auVar74 = vfmadd231ps_avx512vl(auVar82,auVar73,auVar75);
    auVar75 = vmulps_avx512vl(auVar77,auVar86);
    auVar82 = ZEXT1632(auVar46);
    auVar78 = vmulps_avx512vl(auVar78,auVar82);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar69);
    fVar209 = auVar46._0_4_;
    fVar211 = auVar46._4_4_;
    auVar22._4_4_ = fVar211 * auVar70._4_4_;
    auVar22._0_4_ = fVar209 * auVar70._0_4_;
    fVar208 = auVar46._8_4_;
    auVar22._8_4_ = fVar208 * auVar70._8_4_;
    fVar210 = auVar46._12_4_;
    auVar22._12_4_ = fVar210 * auVar70._12_4_;
    auVar22._16_4_ = auVar70._16_4_ * 0.0;
    auVar22._20_4_ = auVar70._20_4_ * 0.0;
    auVar22._24_4_ = auVar70._24_4_ * 0.0;
    auVar22._28_4_ = fVar198;
    auVar23._4_4_ = fVar211 * auVar74._4_4_;
    auVar23._0_4_ = fVar209 * auVar74._0_4_;
    auVar23._8_4_ = fVar208 * auVar74._8_4_;
    auVar23._12_4_ = fVar210 * auVar74._12_4_;
    auVar23._16_4_ = auVar74._16_4_ * 0.0;
    auVar23._20_4_ = auVar74._20_4_ * 0.0;
    auVar23._24_4_ = auVar74._24_4_ * 0.0;
    auVar23._28_4_ = auVar83._28_4_;
    auVar45 = vfmadd231ps_fma(auVar22,auVar73,ZEXT1632(auVar45));
    auVar53 = vfmadd231ps_fma(auVar23,auVar73,ZEXT1632(auVar53));
    auVar120._0_4_ = fVar209 * auVar75._0_4_;
    auVar120._4_4_ = fVar211 * auVar75._4_4_;
    auVar120._8_4_ = fVar208 * auVar75._8_4_;
    auVar120._12_4_ = fVar210 * auVar75._12_4_;
    auVar120._16_4_ = auVar75._16_4_ * 0.0;
    auVar120._20_4_ = auVar75._20_4_ * 0.0;
    auVar120._24_4_ = auVar75._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar24._4_4_ = fVar211 * auVar76._4_4_;
    auVar24._0_4_ = fVar209 * auVar76._0_4_;
    auVar24._8_4_ = fVar208 * auVar76._8_4_;
    auVar24._12_4_ = fVar210 * auVar76._12_4_;
    auVar24._16_4_ = auVar76._16_4_ * 0.0;
    auVar24._20_4_ = auVar76._20_4_ * 0.0;
    auVar24._24_4_ = auVar76._24_4_ * 0.0;
    auVar24._28_4_ = auVar75._28_4_;
    auVar54 = vfmadd231ps_fma(auVar120,auVar73,auVar70);
    auVar55 = vfmadd231ps_fma(auVar24,auVar73,auVar74);
    auVar25._28_4_ = auVar74._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar210 * auVar55._12_4_,
                            CONCAT48(fVar208 * auVar55._8_4_,
                                     CONCAT44(fVar211 * auVar55._4_4_,fVar209 * auVar55._0_4_))));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar210 * auVar54._12_4_,
                                                 CONCAT48(fVar208 * auVar54._8_4_,
                                                          CONCAT44(fVar211 * auVar54._4_4_,
                                                                   fVar209 * auVar54._0_4_)))),
                              auVar73,ZEXT1632(auVar45));
    auVar66 = vfmadd231ps_fma(auVar25,auVar73,ZEXT1632(auVar53));
    auVar70 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar45));
    auVar83 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar53));
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar70 = vmulps_avx512vl(auVar70,auVar74);
    auVar83 = vmulps_avx512vl(auVar83,auVar74);
    auVar189._0_4_ = fVar101 * auVar70._0_4_;
    auVar189._4_4_ = fVar101 * auVar70._4_4_;
    auVar189._8_4_ = fVar101 * auVar70._8_4_;
    auVar189._12_4_ = fVar101 * auVar70._12_4_;
    auVar189._16_4_ = fVar101 * auVar70._16_4_;
    auVar189._20_4_ = fVar101 * auVar70._20_4_;
    auVar189._24_4_ = fVar101 * auVar70._24_4_;
    auVar189._28_4_ = 0;
    auVar70 = vmulps_avx512vl(auVar195,auVar83);
    auVar53 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar53));
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01feed00,ZEXT1632(auVar53));
    auVar121._0_4_ = auVar189._0_4_ + auVar63._0_4_;
    auVar121._4_4_ = auVar189._4_4_ + auVar63._4_4_;
    auVar121._8_4_ = auVar189._8_4_ + auVar63._8_4_;
    auVar121._12_4_ = auVar189._12_4_ + auVar63._12_4_;
    auVar121._16_4_ = auVar189._16_4_ + 0.0;
    auVar121._20_4_ = auVar189._20_4_ + 0.0;
    auVar121._24_4_ = auVar189._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar86 = ZEXT1632(auVar53);
    auVar83 = vpermt2ps_avx512vl(auVar189,_DAT_01feed00,auVar86);
    auVar69 = vaddps_avx512vl(ZEXT1632(auVar66),auVar70);
    auVar77 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar86);
    auVar70 = vsubps_avx(auVar75,auVar83);
    auVar77 = vsubps_avx512vl(auVar76,auVar77);
    auVar83 = vmulps_avx512vl(auVar79,auVar82);
    auVar78 = vmulps_avx512vl(auVar84,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar73,auVar67);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar68);
    auVar67 = vmulps_avx512vl(auVar85,auVar82);
    auVar68 = vmulps_avx512vl(auVar71,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar73,auVar79);
    auVar84 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar84);
    auVar68 = vmulps_avx512vl(auVar80,auVar82);
    auVar79 = vmulps_avx512vl(auVar81,auVar82);
    auVar45 = vfmadd231ps_fma(auVar68,auVar73,auVar85);
    auVar85 = vfmadd231ps_avx512vl(auVar79,auVar73,auVar71);
    auVar68 = vmulps_avx512vl(auVar82,auVar67);
    auVar80 = ZEXT1632(auVar46);
    auVar79 = vmulps_avx512vl(auVar80,auVar84);
    auVar83 = vfmadd231ps_avx512vl(auVar68,auVar73,auVar83);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar73,auVar78);
    auVar85 = vmulps_avx512vl(auVar80,auVar85);
    auVar67 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar210 * auVar45._12_4_,
                                            CONCAT48(fVar208 * auVar45._8_4_,
                                                     CONCAT44(fVar211 * auVar45._4_4_,
                                                              fVar209 * auVar45._0_4_)))),auVar73,
                         auVar67);
    auVar84 = vfmadd231ps_avx512vl(auVar85,auVar73,auVar84);
    auVar26._4_4_ = fVar211 * auVar67._4_4_;
    auVar26._0_4_ = fVar209 * auVar67._0_4_;
    auVar26._8_4_ = fVar208 * auVar67._8_4_;
    auVar26._12_4_ = fVar210 * auVar67._12_4_;
    auVar26._16_4_ = auVar67._16_4_ * 0.0;
    auVar26._20_4_ = auVar67._20_4_ * 0.0;
    auVar26._24_4_ = auVar67._24_4_ * 0.0;
    auVar26._28_4_ = auVar71._28_4_;
    auVar85 = vmulps_avx512vl(auVar80,auVar84);
    auVar71 = vfmadd231ps_avx512vl(auVar26,auVar73,auVar83);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar78,auVar73);
    auVar83 = vsubps_avx512vl(auVar67,auVar83);
    auVar84 = vsubps_avx512vl(auVar84,auVar78);
    auVar83 = vmulps_avx512vl(auVar83,auVar74);
    auVar84 = vmulps_avx512vl(auVar84,auVar74);
    fVar198 = fVar101 * auVar83._0_4_;
    fVar209 = fVar101 * auVar83._4_4_;
    auVar27._4_4_ = fVar209;
    auVar27._0_4_ = fVar198;
    fVar211 = fVar101 * auVar83._8_4_;
    auVar27._8_4_ = fVar211;
    fVar208 = fVar101 * auVar83._12_4_;
    auVar27._12_4_ = fVar208;
    fVar210 = fVar101 * auVar83._16_4_;
    auVar27._16_4_ = fVar210;
    fVar212 = fVar101 * auVar83._20_4_;
    auVar27._20_4_ = fVar212;
    fVar101 = fVar101 * auVar83._24_4_;
    auVar27._24_4_ = fVar101;
    auVar27._28_4_ = auVar83._28_4_;
    auVar84 = vmulps_avx512vl(auVar195,auVar84);
    auVar73 = vpermt2ps_avx512vl(auVar71,_DAT_01feed00,auVar86);
    auVar74 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar86);
    auVar196._0_4_ = auVar71._0_4_ + fVar198;
    auVar196._4_4_ = auVar71._4_4_ + fVar209;
    auVar196._8_4_ = auVar71._8_4_ + fVar211;
    auVar196._12_4_ = auVar71._12_4_ + fVar208;
    auVar196._16_4_ = auVar71._16_4_ + fVar210;
    auVar196._20_4_ = auVar71._20_4_ + fVar212;
    auVar196._24_4_ = auVar71._24_4_ + fVar101;
    auVar196._28_4_ = auVar71._28_4_ + auVar83._28_4_;
    auVar83 = vpermt2ps_avx512vl(auVar27,_DAT_01feed00,ZEXT1632(auVar53));
    auVar78 = vaddps_avx512vl(auVar85,auVar84);
    auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,ZEXT1632(auVar53));
    auVar83 = vsubps_avx(auVar73,auVar83);
    auVar84 = vsubps_avx512vl(auVar74,auVar84);
    auVar133 = ZEXT1632(auVar63);
    auVar67 = vsubps_avx512vl(auVar71,auVar133);
    auVar145 = ZEXT1632(auVar66);
    auVar68 = vsubps_avx512vl(auVar85,auVar145);
    auVar79 = vsubps_avx512vl(auVar73,auVar75);
    auVar67 = vaddps_avx512vl(auVar67,auVar79);
    auVar79 = vsubps_avx512vl(auVar74,auVar76);
    auVar68 = vaddps_avx512vl(auVar68,auVar79);
    auVar79 = vmulps_avx512vl(auVar145,auVar67);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar133,auVar68);
    auVar80 = vmulps_avx512vl(auVar69,auVar67);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar121,auVar68);
    auVar81 = vmulps_avx512vl(auVar77,auVar67);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar70,auVar68);
    auVar82 = vmulps_avx512vl(auVar76,auVar67);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar75,auVar68);
    auVar86 = vmulps_avx512vl(auVar85,auVar67);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar71,auVar68);
    auVar87 = vmulps_avx512vl(auVar78,auVar67);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar196,auVar68);
    auVar88 = vmulps_avx512vl(auVar84,auVar67);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar83,auVar68);
    auVar67 = vmulps_avx512vl(auVar74,auVar67);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar73,auVar68);
    auVar68 = vminps_avx512vl(auVar79,auVar80);
    auVar79 = vmaxps_avx512vl(auVar79,auVar80);
    auVar80 = vminps_avx512vl(auVar81,auVar82);
    auVar68 = vminps_avx512vl(auVar68,auVar80);
    auVar80 = vmaxps_avx512vl(auVar81,auVar82);
    auVar79 = vmaxps_avx512vl(auVar79,auVar80);
    auVar80 = vminps_avx512vl(auVar86,auVar87);
    auVar81 = vmaxps_avx512vl(auVar86,auVar87);
    auVar82 = vminps_avx512vl(auVar88,auVar67);
    auVar80 = vminps_avx512vl(auVar80,auVar82);
    auVar68 = vminps_avx512vl(auVar68,auVar80);
    auVar67 = vmaxps_avx512vl(auVar88,auVar67);
    auVar67 = vmaxps_avx512vl(auVar81,auVar67);
    auVar67 = vmaxps_avx512vl(auVar79,auVar67);
    uVar16 = vcmpps_avx512vl(auVar68,local_260,2);
    uVar17 = vcmpps_avx512vl(auVar67,auVar72,5);
    bVar32 = (byte)uVar16 & (byte)uVar17 & 0x7f;
    auVar245 = ZEXT3264(auVar72);
    if (bVar32 == 0) {
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar67 = vsubps_avx512vl(auVar75,auVar133);
      auVar68 = vsubps_avx512vl(auVar76,auVar145);
      auVar79 = vsubps_avx512vl(auVar73,auVar71);
      auVar67 = vaddps_avx512vl(auVar67,auVar79);
      auVar79 = vsubps_avx512vl(auVar74,auVar85);
      auVar68 = vaddps_avx512vl(auVar68,auVar79);
      auVar79 = vmulps_avx512vl(auVar145,auVar67);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar68,auVar133);
      auVar69 = vmulps_avx512vl(auVar69,auVar67);
      auVar69 = vfnmadd213ps_avx512vl(auVar121,auVar68,auVar69);
      auVar77 = vmulps_avx512vl(auVar77,auVar67);
      auVar77 = vfnmadd213ps_avx512vl(auVar70,auVar68,auVar77);
      auVar70 = vmulps_avx512vl(auVar76,auVar67);
      auVar75 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar75);
      auVar70 = vmulps_avx512vl(auVar85,auVar67);
      auVar71 = vfnmadd231ps_avx512vl(auVar70,auVar68,auVar71);
      auVar70 = vmulps_avx512vl(auVar78,auVar67);
      auVar76 = vfnmadd213ps_avx512vl(auVar196,auVar68,auVar70);
      auVar70 = vmulps_avx512vl(auVar84,auVar67);
      auVar78 = vfnmadd213ps_avx512vl(auVar83,auVar68,auVar70);
      auVar70 = vmulps_avx512vl(auVar74,auVar67);
      auVar73 = vfnmadd231ps_avx512vl(auVar70,auVar73,auVar68);
      auVar83 = vminps_avx(auVar79,auVar69);
      auVar70 = vmaxps_avx(auVar79,auVar69);
      auVar84 = vminps_avx(auVar77,auVar75);
      auVar84 = vminps_avx(auVar83,auVar84);
      auVar83 = vmaxps_avx(auVar77,auVar75);
      auVar70 = vmaxps_avx(auVar70,auVar83);
      auVar85 = vminps_avx(auVar71,auVar76);
      auVar83 = vmaxps_avx(auVar71,auVar76);
      auVar71 = vminps_avx(auVar78,auVar73);
      auVar85 = vminps_avx(auVar85,auVar71);
      auVar85 = vminps_avx(auVar84,auVar85);
      auVar84 = vmaxps_avx(auVar78,auVar73);
      auVar83 = vmaxps_avx(auVar83,auVar84);
      auVar70 = vmaxps_avx(auVar70,auVar83);
      uVar16 = vcmpps_avx512vl(auVar70,auVar72,5);
      uVar17 = vcmpps_avx512vl(auVar85,local_260,2);
      bVar32 = bVar32 & (byte)uVar16 & (byte)uVar17;
      if (bVar32 != 0) {
        auStack_440[uVar28] = (uint)bVar32;
        uVar16 = vmovlps_avx(auVar43);
        (&uStack_240)[uVar28] = uVar16;
        uVar36 = vmovlps_avx(auVar44);
        auStack_1a0[uVar28] = uVar36;
        uVar28 = (ulong)((int)uVar28 + 1);
      }
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar244 = ZEXT3264(_DAT_01feed20);
    auVar243 = ZEXT1664(auVar53);
    auVar242 = ZEXT1664(auVar45);
    auVar241 = ZEXT3264(auVar72);
    auVar240 = ZEXT1664(auVar46);
    auVar239 = ZEXT1664(auVar44);
    auVar238 = ZEXT1664(auVar43);
LAB_01c993c4:
    do {
      do {
        auVar72 = auVar245._0_32_;
        if ((int)uVar28 == 0) {
          if (bVar38) {
            return bVar38;
          }
          uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar21._4_4_ = uVar109;
          auVar21._0_4_ = uVar109;
          auVar21._8_4_ = uVar109;
          auVar21._12_4_ = uVar109;
          auVar21._16_4_ = uVar109;
          auVar21._20_4_ = uVar109;
          auVar21._24_4_ = uVar109;
          auVar21._28_4_ = uVar109;
          uVar16 = vcmpps_avx512vl(local_1c0,auVar21,2);
          uVar37 = (uint)uVar35 & (uint)uVar16;
          uVar35 = (ulong)uVar37;
          if (uVar37 == 0) {
            return bVar38;
          }
          goto LAB_01c986ca;
        }
        uVar33 = (int)uVar28 - 1;
        uVar34 = (ulong)uVar33;
        uVar7 = auStack_440[uVar34];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = auStack_1a0[uVar34];
        uVar36 = 0;
        for (uVar30 = (ulong)uVar7; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar36 = uVar36 + 1;
        }
        uVar29 = uVar7 - 1 & uVar7;
        bVar41 = uVar29 == 0;
        auStack_440[uVar34] = uVar29;
        if (bVar41) {
          uVar28 = (ulong)uVar33;
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar36;
        auVar43 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar36 + 1));
        auVar43 = vcvtqq2ps_avx512vl(auVar43);
        auVar43 = vmulps_avx512vl(auVar43,auVar242._0_16_);
        uVar109 = *(undefined4 *)((long)&uStack_240 + uVar34 * 8 + 4);
        auVar18._4_4_ = uVar109;
        auVar18._0_4_ = uVar109;
        auVar18._8_4_ = uVar109;
        auVar18._12_4_ = uVar109;
        auVar46 = vmulps_avx512vl(auVar43,auVar18);
        auVar45 = auVar243._0_16_;
        auVar43 = vsubps_avx512vl(auVar45,auVar43);
        uVar109 = *(undefined4 *)(&uStack_240 + uVar34);
        auVar19._4_4_ = uVar109;
        auVar19._0_4_ = uVar109;
        auVar19._8_4_ = uVar109;
        auVar19._12_4_ = uVar109;
        auVar43 = vfmadd231ps_avx512vl(auVar46,auVar43,auVar19);
        auVar46 = vmovshdup_avx(auVar43);
        fVar101 = auVar46._0_4_ - auVar43._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar101));
        if (uVar7 == 0 || bVar41) goto LAB_01c98e29;
        auVar46 = vshufps_avx(auVar44,auVar44,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar101));
        auVar55 = vsubps_avx512vl(auVar45,auVar46);
        fVar198 = auVar46._0_4_;
        auVar140._0_4_ = fVar198 * fVar106;
        fVar209 = auVar46._4_4_;
        auVar140._4_4_ = fVar209 * fVar107;
        fVar211 = auVar46._8_4_;
        auVar140._8_4_ = fVar211 * fVar106;
        fVar208 = auVar46._12_4_;
        auVar140._12_4_ = fVar208 * fVar107;
        auVar152._0_4_ = fVar198 * fVar108;
        auVar152._4_4_ = fVar209 * fVar122;
        auVar152._8_4_ = fVar211 * fVar108;
        auVar152._12_4_ = fVar208 * fVar122;
        auVar164._0_4_ = fVar136 * fVar198;
        auVar164._4_4_ = fVar137 * fVar209;
        auVar164._8_4_ = fVar136 * fVar211;
        auVar164._12_4_ = fVar137 * fVar208;
        auVar124._0_4_ = fVar138 * fVar198;
        auVar124._4_4_ = fVar197 * fVar209;
        auVar124._8_4_ = fVar138 * fVar211;
        auVar124._12_4_ = fVar197 * fVar208;
        auVar46 = vfmadd231ps_fma(auVar140,auVar55,auVar163);
        auVar53 = vfmadd231ps_fma(auVar152,auVar55,auVar51);
        auVar54 = vfmadd231ps_fma(auVar164,auVar55,auVar49);
        auVar55 = vfmadd231ps_fma(auVar124,auVar111,auVar55);
        auVar134._16_16_ = auVar46;
        auVar134._0_16_ = auVar46;
        auVar146._16_16_ = auVar53;
        auVar146._0_16_ = auVar53;
        auVar156._16_16_ = auVar54;
        auVar156._0_16_ = auVar54;
        auVar83 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar43));
        auVar70 = vsubps_avx(auVar146,auVar134);
        auVar53 = vfmadd213ps_fma(auVar70,auVar83,auVar134);
        auVar70 = vsubps_avx(auVar156,auVar146);
        auVar63 = vfmadd213ps_fma(auVar70,auVar83,auVar146);
        auVar46 = vsubps_avx(auVar55,auVar54);
        auVar147._16_16_ = auVar46;
        auVar147._0_16_ = auVar46;
        auVar46 = vfmadd213ps_fma(auVar147,auVar83,auVar156);
        auVar70 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar53));
        auVar53 = vfmadd213ps_fma(auVar70,auVar83,ZEXT1632(auVar53));
        auVar70 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar63));
        auVar46 = vfmadd213ps_fma(auVar70,auVar83,ZEXT1632(auVar63));
        auVar70 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar53));
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar70,auVar83);
        auVar70 = vmulps_avx512vl(auVar70,auVar241._0_32_);
        auVar90._16_16_ = auVar70._16_16_;
        fVar198 = fVar101 * 0.33333334;
        auVar165._0_8_ =
             CONCAT44(auVar149._4_4_ + fVar198 * auVar70._4_4_,
                      auVar149._0_4_ + fVar198 * auVar70._0_4_);
        auVar165._8_4_ = auVar149._8_4_ + fVar198 * auVar70._8_4_;
        auVar165._12_4_ = auVar149._12_4_ + fVar198 * auVar70._12_4_;
        auVar141._0_4_ = fVar198 * auVar70._16_4_;
        auVar141._4_4_ = fVar198 * auVar70._20_4_;
        auVar141._8_4_ = fVar198 * auVar70._24_4_;
        auVar141._12_4_ = fVar198 * auVar70._28_4_;
        auVar62 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar63 = vshufpd_avx(auVar149,auVar149,3);
        auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar46 = vsubps_avx(auVar63,auVar149);
        auVar53 = vsubps_avx(auVar66,(undefined1  [16])0x0);
        auVar181._0_4_ = auVar46._0_4_ + auVar53._0_4_;
        auVar181._4_4_ = auVar46._4_4_ + auVar53._4_4_;
        auVar181._8_4_ = auVar46._8_4_ + auVar53._8_4_;
        auVar181._12_4_ = auVar46._12_4_ + auVar53._12_4_;
        auVar46 = vshufps_avx(auVar149,auVar149,0xb1);
        auVar53 = vshufps_avx(auVar165,auVar165,0xb1);
        auVar54 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar229._4_4_ = auVar181._0_4_;
        auVar229._0_4_ = auVar181._0_4_;
        auVar229._8_4_ = auVar181._0_4_;
        auVar229._12_4_ = auVar181._0_4_;
        auVar58 = vshufps_avx(auVar181,auVar181,0x55);
        fVar198 = auVar58._0_4_;
        auVar192._0_4_ = auVar46._0_4_ * fVar198;
        fVar209 = auVar58._4_4_;
        auVar192._4_4_ = auVar46._4_4_ * fVar209;
        fVar211 = auVar58._8_4_;
        auVar192._8_4_ = auVar46._8_4_ * fVar211;
        fVar208 = auVar58._12_4_;
        auVar192._12_4_ = auVar46._12_4_ * fVar208;
        auVar200._0_4_ = auVar53._0_4_ * fVar198;
        auVar200._4_4_ = auVar53._4_4_ * fVar209;
        auVar200._8_4_ = auVar53._8_4_ * fVar211;
        auVar200._12_4_ = auVar53._12_4_ * fVar208;
        auVar216._0_4_ = auVar54._0_4_ * fVar198;
        auVar216._4_4_ = auVar54._4_4_ * fVar209;
        auVar216._8_4_ = auVar54._8_4_ * fVar211;
        auVar216._12_4_ = auVar54._12_4_ * fVar208;
        auVar182._0_4_ = auVar55._0_4_ * fVar198;
        auVar182._4_4_ = auVar55._4_4_ * fVar209;
        auVar182._8_4_ = auVar55._8_4_ * fVar211;
        auVar182._12_4_ = auVar55._12_4_ * fVar208;
        auVar46 = vfmadd231ps_fma(auVar192,auVar229,auVar149);
        auVar53 = vfmadd231ps_fma(auVar200,auVar229,auVar165);
        auVar60 = vfmadd231ps_fma(auVar216,auVar229,auVar62);
        auVar61 = vfmadd231ps_fma(auVar182,(undefined1  [16])0x0,auVar229);
        auVar58 = vshufpd_avx(auVar46,auVar46,1);
        auVar59 = vshufpd_avx(auVar53,auVar53,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
        auVar54 = vminss_avx(auVar46,auVar53);
        auVar46 = vmaxss_avx(auVar53,auVar46);
        auVar55 = vminss_avx(auVar60,auVar61);
        auVar53 = vmaxss_avx(auVar61,auVar60);
        auVar54 = vminss_avx(auVar54,auVar55);
        auVar46 = vmaxss_avx(auVar53,auVar46);
        auVar55 = vminss_avx(auVar58,auVar59);
        auVar53 = vmaxss_avx(auVar59,auVar58);
        auVar58 = vminss_avx512f(auVar56,auVar57);
        auVar59 = vmaxss_avx512f(auVar57,auVar56);
        auVar53 = vmaxss_avx(auVar59,auVar53);
        auVar55 = vminss_avx512f(auVar55,auVar58);
        fVar209 = auVar53._0_4_;
        fVar198 = auVar46._0_4_;
        if (auVar54._0_4_ < 0.0001) {
          bVar42 = fVar209 == -0.0001;
          bVar39 = NAN(fVar209);
          if (fVar209 <= -0.0001) goto LAB_01c995f0;
          break;
        }
LAB_01c995f0:
        vucomiss_avx512f(auVar55);
        bVar42 = fVar209 <= -0.0001;
        bVar40 = -0.0001 < fVar198;
        bVar39 = bVar42;
        if (!bVar42) break;
        uVar16 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar17 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar32 = (byte)uVar16 & (byte)uVar17 & 1;
        bVar42 = bVar40 && bVar32 == 0;
        bVar39 = bVar40 && bVar32 == 0;
      } while (!bVar40 || bVar32 != 0);
      auVar60 = auVar246._0_16_;
      vcmpss_avx512f(auVar54,auVar60,1);
      uVar16 = vcmpss_avx512f(auVar46,auVar60,1);
      bVar40 = (bool)((byte)uVar16 & 1);
      auVar90._0_16_ = auVar247._0_16_;
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar247._0_4_);
      vucomiss_avx512f(auVar89._0_16_);
      bVar39 = (bool)(!bVar42 | bVar39);
      bVar40 = bVar39 == false;
      auVar92._16_16_ = auVar90._16_16_;
      auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar39 * auVar246._0_4_ + (uint)!bVar39 * 0x7f800000;
      auVar59 = auVar91._0_16_;
      auVar94._16_16_ = auVar90._16_16_;
      auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar39 * auVar246._0_4_ + (uint)!bVar39 * -0x800000;
      auVar58 = auVar93._0_16_;
      uVar16 = vcmpss_avx512f(auVar55,auVar60,1);
      bVar42 = (bool)((byte)uVar16 & 1);
      auVar96._16_16_ = auVar90._16_16_;
      auVar96._0_16_ = auVar247._0_16_;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * auVar247._0_4_);
      vucomiss_avx512f(auVar95._0_16_);
      if ((bVar39) || (bVar40)) {
        auVar55 = vucomiss_avx512f(auVar54);
        if ((bVar39) || (bVar40)) {
          auVar61 = vxorps_avx512vl(auVar54,auVar240._0_16_);
          auVar54 = vsubss_avx512f(auVar55,auVar54);
          auVar54 = vdivss_avx512f(auVar61,auVar54);
          auVar55 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
          auVar55 = vfmadd213ss_avx512f(auVar55,auVar60,auVar54);
          auVar54 = auVar55;
        }
        else {
          auVar54 = vxorps_avx512vl(auVar55,auVar55);
          vucomiss_avx512f(auVar54);
          auVar55 = ZEXT416(0x3f800000);
          if ((bVar39) || (bVar40)) {
            auVar55 = SUB6416(ZEXT464(0xff800000),0);
            auVar54 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar59 = vminss_avx512f(auVar59,auVar54);
        auVar58 = vmaxss_avx(auVar55,auVar58);
      }
      auVar247 = ZEXT464(0x3f800000);
      uVar16 = vcmpss_avx512f(auVar53,auVar60,1);
      bVar42 = (bool)((byte)uVar16 & 1);
      auVar53 = auVar247._0_16_;
      fVar211 = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * 0x3f800000);
      if ((auVar89._0_4_ != fVar211) || (NAN(auVar89._0_4_) || NAN(fVar211))) {
        if ((fVar209 != fVar198) || (NAN(fVar209) || NAN(fVar198))) {
          auVar46 = vxorps_avx512vl(auVar46,auVar240._0_16_);
          auVar183._0_4_ = auVar46._0_4_ / (fVar209 - fVar198);
          auVar183._4_12_ = auVar46._4_12_;
          auVar46 = vsubss_avx512f(auVar53,auVar183);
          auVar46 = vfmadd213ss_avx512f(auVar46,auVar60,auVar183);
          auVar54 = auVar46;
        }
        else if ((fVar198 != 0.0) ||
                (auVar46 = auVar53, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar198))) {
          auVar46 = SUB6416(ZEXT464(0xff800000),0);
          auVar54 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar59 = vminss_avx(auVar59,auVar54);
        auVar58 = vmaxss_avx(auVar46,auVar58);
      }
      bVar42 = auVar95._0_4_ != fVar211;
      auVar46 = vminss_avx512f(auVar59,auVar53);
      auVar98._16_16_ = auVar90._16_16_;
      auVar98._0_16_ = auVar59;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar42 * auVar46._0_4_ + (uint)!bVar42 * auVar59._0_4_;
      auVar46 = vmaxss_avx512f(auVar53,auVar58);
      auVar100._16_16_ = auVar90._16_16_;
      auVar100._0_16_ = auVar58;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (uint)bVar42 * auVar46._0_4_ + (uint)!bVar42 * auVar58._0_4_;
      auVar46 = vmaxss_avx512f(auVar60,auVar97._0_16_);
      auVar54 = vminss_avx512f(auVar99._0_16_,auVar53);
    } while (auVar54._0_4_ < auVar46._0_4_);
    auVar60 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar46._0_4_ + -0.1)));
    auVar61 = vminss_avx512f(ZEXT416((uint)(auVar54._0_4_ + 0.1)),auVar53);
    auVar125._0_8_ = auVar149._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar201._8_8_ = auVar165._0_8_;
    auVar201._0_8_ = auVar165._0_8_;
    auVar217._8_8_ = auVar62._0_8_;
    auVar217._0_8_ = auVar62._0_8_;
    auVar46 = vshufpd_avx(auVar165,auVar165,3);
    auVar54 = vshufpd_avx(auVar62,auVar62,3);
    auVar55 = vshufps_avx(auVar60,auVar61,0);
    auVar59 = vsubps_avx512vl(auVar45,auVar55);
    fVar198 = auVar55._0_4_;
    auVar153._0_4_ = fVar198 * auVar63._0_4_;
    fVar209 = auVar55._4_4_;
    auVar153._4_4_ = fVar209 * auVar63._4_4_;
    fVar211 = auVar55._8_4_;
    auVar153._8_4_ = fVar211 * auVar63._8_4_;
    fVar208 = auVar55._12_4_;
    auVar153._12_4_ = fVar208 * auVar63._12_4_;
    auVar166._0_4_ = fVar198 * auVar46._0_4_;
    auVar166._4_4_ = fVar209 * auVar46._4_4_;
    auVar166._8_4_ = fVar211 * auVar46._8_4_;
    auVar166._12_4_ = fVar208 * auVar46._12_4_;
    auVar232._0_4_ = auVar54._0_4_ * fVar198;
    auVar232._4_4_ = auVar54._4_4_ * fVar209;
    auVar232._8_4_ = auVar54._8_4_ * fVar211;
    auVar232._12_4_ = auVar54._12_4_ * fVar208;
    auVar142._0_4_ = fVar198 * auVar66._0_4_;
    auVar142._4_4_ = fVar209 * auVar66._4_4_;
    auVar142._8_4_ = fVar211 * auVar66._8_4_;
    auVar142._12_4_ = fVar208 * auVar66._12_4_;
    auVar63 = vfmadd231ps_fma(auVar153,auVar59,auVar125);
    auVar66 = vfmadd231ps_fma(auVar166,auVar59,auVar201);
    auVar58 = vfmadd231ps_fma(auVar232,auVar59,auVar217);
    auVar59 = vfmadd231ps_fma(auVar142,auVar59,ZEXT816(0));
    auVar54 = vsubss_avx512f(auVar53,auVar60);
    auVar46 = vmovshdup_avx(auVar44);
    auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar60._0_4_)),auVar44,auVar54);
    auVar54 = vsubss_avx512f(auVar53,auVar61);
    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar61._0_4_)),auVar44,auVar54);
    auVar62 = vdivss_avx512f(auVar53,ZEXT416((uint)fVar101));
    auVar44 = vsubps_avx(auVar66,auVar63);
    auVar150 = auVar238._0_16_;
    auVar54 = vmulps_avx512vl(auVar44,auVar150);
    auVar44 = vsubps_avx(auVar58,auVar66);
    auVar55 = vmulps_avx512vl(auVar44,auVar150);
    auVar44 = vsubps_avx(auVar59,auVar58);
    auVar44 = vmulps_avx512vl(auVar44,auVar150);
    auVar46 = vminps_avx(auVar55,auVar44);
    auVar44 = vmaxps_avx(auVar55,auVar44);
    auVar46 = vminps_avx(auVar54,auVar46);
    auVar44 = vmaxps_avx(auVar54,auVar44);
    auVar54 = vshufpd_avx(auVar46,auVar46,3);
    auVar55 = vshufpd_avx(auVar44,auVar44,3);
    auVar46 = vminps_avx(auVar46,auVar54);
    auVar44 = vmaxps_avx(auVar44,auVar55);
    fVar101 = auVar62._0_4_;
    auVar184._0_4_ = auVar46._0_4_ * fVar101;
    auVar184._4_4_ = auVar46._4_4_ * fVar101;
    auVar184._8_4_ = auVar46._8_4_ * fVar101;
    auVar184._12_4_ = auVar46._12_4_ * fVar101;
    auVar173._0_4_ = fVar101 * auVar44._0_4_;
    auVar173._4_4_ = fVar101 * auVar44._4_4_;
    auVar173._8_4_ = fVar101 * auVar44._8_4_;
    auVar173._12_4_ = fVar101 * auVar44._12_4_;
    auVar62 = vdivss_avx512f(auVar53,ZEXT416((uint)(auVar56._0_4_ - auVar149._0_4_)));
    auVar44 = vshufpd_avx(auVar63,auVar63,3);
    auVar46 = vshufpd_avx(auVar66,auVar66,3);
    auVar54 = vshufpd_avx(auVar58,auVar58,3);
    auVar55 = vshufpd_avx(auVar59,auVar59,3);
    auVar44 = vsubps_avx(auVar44,auVar63);
    auVar63 = vsubps_avx(auVar46,auVar66);
    auVar66 = vsubps_avx(auVar54,auVar58);
    auVar55 = vsubps_avx(auVar55,auVar59);
    auVar46 = vminps_avx(auVar44,auVar63);
    auVar44 = vmaxps_avx(auVar44,auVar63);
    auVar54 = vminps_avx(auVar66,auVar55);
    auVar54 = vminps_avx(auVar46,auVar54);
    auVar46 = vmaxps_avx(auVar66,auVar55);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    fVar101 = auVar62._0_4_;
    auVar218._0_4_ = fVar101 * auVar54._0_4_;
    auVar218._4_4_ = fVar101 * auVar54._4_4_;
    auVar218._8_4_ = fVar101 * auVar54._8_4_;
    auVar218._12_4_ = fVar101 * auVar54._12_4_;
    auVar202._0_4_ = fVar101 * auVar44._0_4_;
    auVar202._4_4_ = fVar101 * auVar44._4_4_;
    auVar202._8_4_ = fVar101 * auVar44._8_4_;
    auVar202._12_4_ = fVar101 * auVar44._12_4_;
    auVar55 = vinsertps_avx(auVar43,auVar149,0x10);
    auVar57 = vpermt2ps_avx512vl(auVar43,_DAT_01feecd0,auVar56);
    auVar112._0_4_ = auVar55._0_4_ + auVar57._0_4_;
    auVar112._4_4_ = auVar55._4_4_ + auVar57._4_4_;
    auVar112._8_4_ = auVar55._8_4_ + auVar57._8_4_;
    auVar112._12_4_ = auVar55._12_4_ + auVar57._12_4_;
    auVar20._8_4_ = 0x3f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar20._12_4_ = 0x3f000000;
    auVar62 = vmulps_avx512vl(auVar112,auVar20);
    auVar46 = vshufps_avx(auVar62,auVar62,0x54);
    uVar109 = auVar62._0_4_;
    auVar116._4_4_ = uVar109;
    auVar116._0_4_ = uVar109;
    auVar116._8_4_ = uVar109;
    auVar116._12_4_ = uVar109;
    auVar54 = vfmadd213ps_fma(auVar52,auVar116,auVar50);
    auVar63 = vfmadd213ps_fma(local_270,auVar116,auVar4);
    auVar66 = vfmadd213ps_fma(local_280,auVar116,auVar48);
    auVar44 = vsubps_avx(auVar63,auVar54);
    auVar54 = vfmadd213ps_fma(auVar44,auVar116,auVar54);
    auVar44 = vsubps_avx(auVar66,auVar63);
    auVar44 = vfmadd213ps_fma(auVar44,auVar116,auVar63);
    auVar44 = vsubps_avx(auVar44,auVar54);
    auVar54 = vfmadd231ps_fma(auVar54,auVar44,auVar116);
    auVar58 = vmulps_avx512vl(auVar44,auVar150);
    auVar226._8_8_ = auVar54._0_8_;
    auVar226._0_8_ = auVar54._0_8_;
    auVar44 = vshufpd_avx(auVar54,auVar54,3);
    auVar54 = vshufps_avx(auVar62,auVar62,0x55);
    auVar63 = vsubps_avx(auVar44,auVar226);
    auVar66 = vfmadd231ps_fma(auVar226,auVar54,auVar63);
    auVar233._8_8_ = auVar58._0_8_;
    auVar233._0_8_ = auVar58._0_8_;
    auVar44 = vshufpd_avx(auVar58,auVar58,3);
    auVar44 = vsubps_avx512vl(auVar44,auVar233);
    auVar44 = vfmadd213ps_avx512vl(auVar44,auVar54,auVar233);
    auVar117._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
    auVar117._8_4_ = auVar63._8_4_ ^ 0x80000000;
    auVar117._12_4_ = auVar63._12_4_ ^ 0x80000000;
    auVar54 = vmovshdup_avx512vl(auVar44);
    auVar234._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
    auVar234._8_4_ = auVar54._8_4_ ^ 0x80000000;
    auVar234._12_4_ = auVar54._12_4_ ^ 0x80000000;
    auVar58 = vmovshdup_avx512vl(auVar63);
    auVar59 = vpermt2ps_avx512vl(auVar234,ZEXT416(5),auVar63);
    auVar54 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar63._0_4_)),auVar44,auVar58);
    auVar63 = vpermt2ps_avx512vl(auVar44,SUB6416(ZEXT464(4),0),auVar117);
    auVar143._0_4_ = auVar54._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar44 = vdivps_avx(auVar59,auVar143);
    auVar64 = vdivps_avx512vl(auVar63,auVar143);
    fVar101 = auVar66._0_4_;
    auVar54 = vshufps_avx(auVar66,auVar66,0x55);
    auVar227._0_4_ = fVar101 * auVar44._0_4_ + auVar54._0_4_ * auVar64._0_4_;
    auVar227._4_4_ = fVar101 * auVar44._4_4_ + auVar54._4_4_ * auVar64._4_4_;
    auVar227._8_4_ = fVar101 * auVar44._8_4_ + auVar54._8_4_ * auVar64._8_4_;
    auVar227._12_4_ = fVar101 * auVar44._12_4_ + auVar54._12_4_ * auVar64._12_4_;
    auVar60 = vsubps_avx(auVar46,auVar227);
    auVar54 = vmovshdup_avx(auVar44);
    auVar46 = vinsertps_avx(auVar184,auVar218,0x1c);
    auVar235._0_4_ = auVar54._0_4_ * auVar46._0_4_;
    auVar235._4_4_ = auVar54._4_4_ * auVar46._4_4_;
    auVar235._8_4_ = auVar54._8_4_ * auVar46._8_4_;
    auVar235._12_4_ = auVar54._12_4_ * auVar46._12_4_;
    auVar61 = vinsertps_avx512f(auVar173,auVar202,0x1c);
    auVar54 = vmulps_avx512vl(auVar54,auVar61);
    auVar59 = vminps_avx512vl(auVar235,auVar54);
    auVar66 = vmaxps_avx(auVar54,auVar235);
    auVar58 = vmovshdup_avx(auVar64);
    auVar54 = vinsertps_avx(auVar218,auVar184,0x4c);
    auVar219._0_4_ = auVar58._0_4_ * auVar54._0_4_;
    auVar219._4_4_ = auVar58._4_4_ * auVar54._4_4_;
    auVar219._8_4_ = auVar58._8_4_ * auVar54._8_4_;
    auVar219._12_4_ = auVar58._12_4_ * auVar54._12_4_;
    auVar63 = vinsertps_avx(auVar202,auVar173,0x4c);
    auVar203._0_4_ = auVar58._0_4_ * auVar63._0_4_;
    auVar203._4_4_ = auVar58._4_4_ * auVar63._4_4_;
    auVar203._8_4_ = auVar58._8_4_ * auVar63._8_4_;
    auVar203._12_4_ = auVar58._12_4_ * auVar63._12_4_;
    auVar58 = vminps_avx(auVar219,auVar203);
    auVar59 = vaddps_avx512vl(auVar59,auVar58);
    auVar58 = vmaxps_avx(auVar203,auVar219);
    auVar204._0_4_ = auVar66._0_4_ + auVar58._0_4_;
    auVar204._4_4_ = auVar66._4_4_ + auVar58._4_4_;
    auVar204._8_4_ = auVar66._8_4_ + auVar58._8_4_;
    auVar204._12_4_ = auVar66._12_4_ + auVar58._12_4_;
    auVar220._8_8_ = 0x3f80000000000000;
    auVar220._0_8_ = 0x3f80000000000000;
    auVar66 = vsubps_avx(auVar220,auVar204);
    auVar58 = vsubps_avx(auVar220,auVar59);
    auVar59 = vsubps_avx(auVar55,auVar62);
    auVar62 = vsubps_avx(auVar57,auVar62);
    fVar208 = auVar59._0_4_;
    auVar236._0_4_ = fVar208 * auVar66._0_4_;
    fVar210 = auVar59._4_4_;
    auVar236._4_4_ = fVar210 * auVar66._4_4_;
    fVar212 = auVar59._8_4_;
    auVar236._8_4_ = fVar212 * auVar66._8_4_;
    fVar213 = auVar59._12_4_;
    auVar236._12_4_ = fVar213 * auVar66._12_4_;
    auVar65 = vbroadcastss_avx512vl(auVar44);
    auVar46 = vmulps_avx512vl(auVar65,auVar46);
    auVar61 = vmulps_avx512vl(auVar65,auVar61);
    auVar65 = vminps_avx512vl(auVar46,auVar61);
    auVar61 = vmaxps_avx512vl(auVar61,auVar46);
    auVar46 = vbroadcastss_avx512vl(auVar64);
    auVar54 = vmulps_avx512vl(auVar46,auVar54);
    auVar46 = vmulps_avx512vl(auVar46,auVar63);
    auVar63 = vminps_avx512vl(auVar54,auVar46);
    auVar63 = vaddps_avx512vl(auVar65,auVar63);
    auVar59 = vmulps_avx512vl(auVar59,auVar58);
    fVar101 = auVar62._0_4_;
    auVar205._0_4_ = fVar101 * auVar66._0_4_;
    fVar198 = auVar62._4_4_;
    auVar205._4_4_ = fVar198 * auVar66._4_4_;
    fVar209 = auVar62._8_4_;
    auVar205._8_4_ = fVar209 * auVar66._8_4_;
    fVar211 = auVar62._12_4_;
    auVar205._12_4_ = fVar211 * auVar66._12_4_;
    auVar221._0_4_ = fVar101 * auVar58._0_4_;
    auVar221._4_4_ = fVar198 * auVar58._4_4_;
    auVar221._8_4_ = fVar209 * auVar58._8_4_;
    auVar221._12_4_ = fVar211 * auVar58._12_4_;
    auVar46 = vmaxps_avx(auVar46,auVar54);
    auVar174._0_4_ = auVar61._0_4_ + auVar46._0_4_;
    auVar174._4_4_ = auVar61._4_4_ + auVar46._4_4_;
    auVar174._8_4_ = auVar61._8_4_ + auVar46._8_4_;
    auVar174._12_4_ = auVar61._12_4_ + auVar46._12_4_;
    auVar185._8_8_ = 0x3f800000;
    auVar185._0_8_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar185,auVar174);
    auVar54 = vsubps_avx512vl(auVar185,auVar63);
    auVar230._0_4_ = fVar208 * auVar46._0_4_;
    auVar230._4_4_ = fVar210 * auVar46._4_4_;
    auVar230._8_4_ = fVar212 * auVar46._8_4_;
    auVar230._12_4_ = fVar213 * auVar46._12_4_;
    auVar228._0_4_ = fVar208 * auVar54._0_4_;
    auVar228._4_4_ = fVar210 * auVar54._4_4_;
    auVar228._8_4_ = fVar212 * auVar54._8_4_;
    auVar228._12_4_ = fVar213 * auVar54._12_4_;
    auVar175._0_4_ = fVar101 * auVar46._0_4_;
    auVar175._4_4_ = fVar198 * auVar46._4_4_;
    auVar175._8_4_ = fVar209 * auVar46._8_4_;
    auVar175._12_4_ = fVar211 * auVar46._12_4_;
    auVar186._0_4_ = fVar101 * auVar54._0_4_;
    auVar186._4_4_ = fVar198 * auVar54._4_4_;
    auVar186._8_4_ = fVar209 * auVar54._8_4_;
    auVar186._12_4_ = fVar211 * auVar54._12_4_;
    auVar46 = vminps_avx(auVar230,auVar228);
    auVar54 = vminps_avx512vl(auVar175,auVar186);
    auVar63 = vminps_avx512vl(auVar46,auVar54);
    auVar46 = vmaxps_avx(auVar228,auVar230);
    auVar54 = vmaxps_avx(auVar186,auVar175);
    auVar54 = vmaxps_avx(auVar54,auVar46);
    auVar66 = vminps_avx512vl(auVar236,auVar59);
    auVar46 = vminps_avx(auVar205,auVar221);
    auVar46 = vminps_avx(auVar66,auVar46);
    auVar46 = vhaddps_avx(auVar63,auVar46);
    auVar66 = vmaxps_avx512vl(auVar59,auVar236);
    auVar63 = vmaxps_avx(auVar221,auVar205);
    auVar63 = vmaxps_avx(auVar63,auVar66);
    auVar54 = vhaddps_avx(auVar54,auVar63);
    auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
    auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
    auVar176._0_4_ = auVar46._0_4_ + auVar60._0_4_;
    auVar176._4_4_ = auVar46._4_4_ + auVar60._4_4_;
    auVar176._8_4_ = auVar46._8_4_ + auVar60._8_4_;
    auVar176._12_4_ = auVar46._12_4_ + auVar60._12_4_;
    auVar187._0_4_ = auVar54._0_4_ + auVar60._0_4_;
    auVar187._4_4_ = auVar54._4_4_ + auVar60._4_4_;
    auVar187._8_4_ = auVar54._8_4_ + auVar60._8_4_;
    auVar187._12_4_ = auVar54._12_4_ + auVar60._12_4_;
    auVar46 = vmaxps_avx(auVar55,auVar176);
    auVar54 = vminps_avx(auVar187,auVar57);
    uVar36 = vcmpps_avx512vl(auVar54,auVar46,1);
    auVar46 = ZEXT416(5);
    if ((uVar36 & 3) != 0) {
      auVar43 = vxorps_avx512vl(ZEXT416(5),auVar46);
      auVar246 = ZEXT1664(auVar43);
      goto LAB_01c993c4;
    }
    uVar36 = vcmpps_avx512vl(auVar187,auVar57,1);
    uVar16 = vcmpps_avx512vl(auVar43,auVar176,1);
    if (((ushort)uVar16 & (ushort)uVar36 & 1) == 0) {
      bVar32 = 0;
    }
    else {
      auVar54 = vmovshdup_avx(auVar176);
      bVar32 = auVar149._0_4_ < auVar54._0_4_ & (byte)(uVar36 >> 1) & 0x7f;
    }
    auVar46 = vxorps_avx512vl(auVar46,auVar46);
    auVar246 = ZEXT1664(auVar46);
    local_450 = auVar47._0_4_;
    fStack_44c = auVar47._4_4_;
    fStack_448 = auVar47._8_4_;
    fStack_444 = auVar47._12_4_;
    if (((3 < (uint)uVar28 || uVar7 != 0 && !bVar41) | bVar32) == 1) {
      lVar31 = 200;
      do {
        auVar43 = vsubss_avx512f(auVar53,auVar60);
        fVar209 = auVar43._0_4_;
        fVar101 = fVar209 * fVar209 * fVar209;
        fVar211 = auVar60._0_4_;
        fVar198 = fVar211 * 3.0 * fVar209 * fVar209;
        fVar209 = fVar209 * fVar211 * fVar211 * 3.0;
        auVar131._4_4_ = fVar101;
        auVar131._0_4_ = fVar101;
        auVar131._8_4_ = fVar101;
        auVar131._12_4_ = fVar101;
        auVar126._4_4_ = fVar198;
        auVar126._0_4_ = fVar198;
        auVar126._8_4_ = fVar198;
        auVar126._12_4_ = fVar198;
        auVar103._4_4_ = fVar209;
        auVar103._0_4_ = fVar209;
        auVar103._8_4_ = fVar209;
        auVar103._12_4_ = fVar209;
        fVar211 = fVar211 * fVar211 * fVar211;
        auVar154._0_4_ = local_450 * fVar211;
        auVar154._4_4_ = fStack_44c * fVar211;
        auVar154._8_4_ = fStack_448 * fVar211;
        auVar154._12_4_ = fStack_444 * fVar211;
        auVar43 = vfmadd231ps_fma(auVar154,auVar48,auVar103);
        auVar43 = vfmadd231ps_fma(auVar43,auVar4,auVar126);
        auVar43 = vfmadd231ps_fma(auVar43,auVar50,auVar131);
        auVar104._8_8_ = auVar43._0_8_;
        auVar104._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar54 = vshufps_avx(auVar60,auVar60,0x55);
        auVar43 = vsubps_avx(auVar43,auVar104);
        auVar54 = vfmadd213ps_fma(auVar43,auVar54,auVar104);
        fVar101 = auVar54._0_4_;
        auVar43 = vshufps_avx(auVar54,auVar54,0x55);
        auVar105._0_4_ = auVar44._0_4_ * fVar101 + auVar64._0_4_ * auVar43._0_4_;
        auVar105._4_4_ = auVar44._4_4_ * fVar101 + auVar64._4_4_ * auVar43._4_4_;
        auVar105._8_4_ = auVar44._8_4_ * fVar101 + auVar64._8_4_ * auVar43._8_4_;
        auVar105._12_4_ = auVar44._12_4_ * fVar101 + auVar64._12_4_ * auVar43._12_4_;
        auVar60 = vsubps_avx(auVar60,auVar105);
        auVar43 = vandps_avx512vl(auVar54,auVar239._0_16_);
        auVar54 = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar54,auVar43);
        bVar41 = auVar43._0_4_ <= fVar123;
        if (auVar43._0_4_ < fVar123) {
          auVar43 = vucomiss_avx512f(auVar46);
          if (bVar41) {
            auVar44 = vucomiss_avx512f(auVar43);
            auVar247 = ZEXT1664(auVar44);
            if (bVar41) {
              vmovshdup_avx(auVar43);
              auVar44 = vucomiss_avx512f(auVar46);
              if (bVar41) {
                auVar53 = vucomiss_avx512f(auVar44);
                auVar247 = ZEXT1664(auVar53);
                if (bVar41) {
                  auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar60 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar54 = vdpps_avx(auVar60,local_290,0x7f);
                  auVar55 = vdpps_avx(auVar60,local_2a0,0x7f);
                  auVar63 = vdpps_avx(auVar60,local_2b0,0x7f);
                  auVar66 = vdpps_avx(auVar60,local_2c0,0x7f);
                  auVar58 = vdpps_avx(auVar60,local_2d0,0x7f);
                  auVar59 = vdpps_avx(auVar60,local_2e0,0x7f);
                  auVar62 = vdpps_avx(auVar60,local_2f0,0x7f);
                  auVar60 = vdpps_avx(auVar60,local_300,0x7f);
                  auVar61 = vsubss_avx512f(auVar53,auVar44);
                  fVar101 = auVar44._0_4_;
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar58._0_4_)),auVar61,auVar54
                                           );
                  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar101)),auVar61,auVar55
                                           );
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar101)),auVar61,auVar63
                                           );
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar60._0_4_)),auVar61,auVar66
                                           );
                  auVar53 = vsubss_avx512f(auVar53,auVar43);
                  auVar155._0_4_ = auVar53._0_4_;
                  fVar101 = auVar155._0_4_ * auVar155._0_4_ * auVar155._0_4_;
                  local_120 = auVar43._0_4_;
                  fVar198 = local_120 * 3.0 * auVar155._0_4_ * auVar155._0_4_;
                  fVar209 = auVar155._0_4_ * local_120 * local_120 * 3.0;
                  fVar211 = local_120 * local_120 * local_120;
                  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar63._0_4_)),
                                            ZEXT416((uint)fVar209),auVar55);
                  auVar53 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar198),auVar54);
                  vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar101),auVar44);
                  auVar44 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar41) {
                    fVar208 = *(float *)(ray + k * 4 + 0x100);
                    if (auVar44._0_4_ <= fVar208) {
                      auVar53 = vshufps_avx(auVar43,auVar43,0x55);
                      auVar55 = vsubps_avx512vl(auVar45,auVar53);
                      fVar210 = auVar53._0_4_;
                      auVar188._0_4_ = fVar210 * (float)local_320._0_4_;
                      fVar212 = auVar53._4_4_;
                      auVar188._4_4_ = fVar212 * (float)local_320._4_4_;
                      fVar213 = auVar53._8_4_;
                      auVar188._8_4_ = fVar213 * fStack_318;
                      fVar222 = auVar53._12_4_;
                      auVar188._12_4_ = fVar222 * fStack_314;
                      auVar193._0_4_ = fVar210 * (float)local_370._0_4_;
                      auVar193._4_4_ = fVar212 * (float)local_370._4_4_;
                      auVar193._8_4_ = fVar213 * fStack_368;
                      auVar193._12_4_ = fVar222 * fStack_364;
                      auVar206._0_4_ = fVar210 * (float)local_380._0_4_;
                      auVar206._4_4_ = fVar212 * (float)local_380._4_4_;
                      auVar206._8_4_ = fVar213 * fStack_378;
                      auVar206._12_4_ = fVar222 * fStack_374;
                      auVar167._0_4_ = fVar210 * (float)local_340._0_4_;
                      auVar167._4_4_ = fVar212 * (float)local_340._4_4_;
                      auVar167._8_4_ = fVar213 * fStack_338;
                      auVar167._12_4_ = fVar222 * fStack_334;
                      auVar45 = vfmadd231ps_fma(auVar188,auVar55,local_310);
                      auVar53 = vfmadd231ps_fma(auVar193,auVar55,local_350);
                      auVar54 = vfmadd231ps_fma(auVar206,auVar55,local_360);
                      auVar55 = vfmadd231ps_fma(auVar167,auVar55,local_330);
                      auVar45 = vsubps_avx(auVar53,auVar45);
                      auVar53 = vsubps_avx(auVar54,auVar53);
                      auVar54 = vsubps_avx(auVar55,auVar54);
                      auVar207._0_4_ = local_120 * auVar53._0_4_;
                      auVar207._4_4_ = local_120 * auVar53._4_4_;
                      auVar207._8_4_ = local_120 * auVar53._8_4_;
                      auVar207._12_4_ = local_120 * auVar53._12_4_;
                      auVar155._4_4_ = auVar155._0_4_;
                      auVar155._8_4_ = auVar155._0_4_;
                      auVar155._12_4_ = auVar155._0_4_;
                      auVar45 = vfmadd231ps_fma(auVar207,auVar155,auVar45);
                      auVar168._0_4_ = local_120 * auVar54._0_4_;
                      auVar168._4_4_ = local_120 * auVar54._4_4_;
                      auVar168._8_4_ = local_120 * auVar54._8_4_;
                      auVar168._12_4_ = local_120 * auVar54._12_4_;
                      auVar53 = vfmadd231ps_fma(auVar168,auVar155,auVar53);
                      auVar169._0_4_ = local_120 * auVar53._0_4_;
                      auVar169._4_4_ = local_120 * auVar53._4_4_;
                      auVar169._8_4_ = local_120 * auVar53._8_4_;
                      auVar169._12_4_ = local_120 * auVar53._12_4_;
                      auVar45 = vfmadd231ps_fma(auVar169,auVar155,auVar45);
                      auVar45 = vmulps_avx512vl(auVar45,auVar150);
                      pGVar8 = (context->scene->geometries).items[uVar37].ptr;
                      if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar32 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar32 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_400 = auVar72;
                        auVar144._0_4_ = fVar211 * (float)local_3c0._0_4_;
                        auVar144._4_4_ = fVar211 * (float)local_3c0._4_4_;
                        auVar144._8_4_ = fVar211 * fStack_3b8;
                        auVar144._12_4_ = fVar211 * fStack_3b4;
                        auVar132._4_4_ = fVar209;
                        auVar132._0_4_ = fVar209;
                        auVar132._8_4_ = fVar209;
                        auVar132._12_4_ = fVar209;
                        auVar53 = vfmadd132ps_fma(auVar132,auVar144,local_3b0);
                        auVar127._4_4_ = fVar198;
                        auVar127._0_4_ = fVar198;
                        auVar127._8_4_ = fVar198;
                        auVar127._12_4_ = fVar198;
                        auVar53 = vfmadd132ps_fma(auVar127,auVar53,local_3a0);
                        auVar118._4_4_ = fVar101;
                        auVar118._0_4_ = fVar101;
                        auVar118._8_4_ = fVar101;
                        auVar118._12_4_ = fVar101;
                        auVar55 = vfmadd132ps_fma(auVar118,auVar53,local_390);
                        auVar53 = vshufps_avx(auVar55,auVar55,0xc9);
                        auVar54 = vshufps_avx(auVar45,auVar45,0xc9);
                        auVar119._0_4_ = auVar55._0_4_ * auVar54._0_4_;
                        auVar119._4_4_ = auVar55._4_4_ * auVar54._4_4_;
                        auVar119._8_4_ = auVar55._8_4_ * auVar54._8_4_;
                        auVar119._12_4_ = auVar55._12_4_ * auVar54._12_4_;
                        auVar45 = vfmsub231ps_fma(auVar119,auVar45,auVar53);
                        auVar135._8_4_ = 1;
                        auVar135._0_8_ = 0x100000001;
                        auVar135._12_4_ = 1;
                        auVar135._16_4_ = 1;
                        auVar135._20_4_ = 1;
                        auVar135._24_4_ = 1;
                        auVar135._28_4_ = 1;
                        local_100 = vpermps_avx2(auVar135,ZEXT1632(auVar43));
                        auVar72 = vpermps_avx2(auVar135,ZEXT1632(auVar45));
                        auVar148._8_4_ = 2;
                        auVar148._0_8_ = 0x200000002;
                        auVar148._12_4_ = 2;
                        auVar148._16_4_ = 2;
                        auVar148._20_4_ = 2;
                        auVar148._24_4_ = 2;
                        auVar148._28_4_ = 2;
                        local_160 = vpermps_avx2(auVar148,ZEXT1632(auVar45));
                        local_140 = auVar45._0_4_;
                        local_180[0] = (RTCHitN)auVar72[0];
                        local_180[1] = (RTCHitN)auVar72[1];
                        local_180[2] = (RTCHitN)auVar72[2];
                        local_180[3] = (RTCHitN)auVar72[3];
                        local_180[4] = (RTCHitN)auVar72[4];
                        local_180[5] = (RTCHitN)auVar72[5];
                        local_180[6] = (RTCHitN)auVar72[6];
                        local_180[7] = (RTCHitN)auVar72[7];
                        local_180[8] = (RTCHitN)auVar72[8];
                        local_180[9] = (RTCHitN)auVar72[9];
                        local_180[10] = (RTCHitN)auVar72[10];
                        local_180[0xb] = (RTCHitN)auVar72[0xb];
                        local_180[0xc] = (RTCHitN)auVar72[0xc];
                        local_180[0xd] = (RTCHitN)auVar72[0xd];
                        local_180[0xe] = (RTCHitN)auVar72[0xe];
                        local_180[0xf] = (RTCHitN)auVar72[0xf];
                        local_180[0x10] = (RTCHitN)auVar72[0x10];
                        local_180[0x11] = (RTCHitN)auVar72[0x11];
                        local_180[0x12] = (RTCHitN)auVar72[0x12];
                        local_180[0x13] = (RTCHitN)auVar72[0x13];
                        local_180[0x14] = (RTCHitN)auVar72[0x14];
                        local_180[0x15] = (RTCHitN)auVar72[0x15];
                        local_180[0x16] = (RTCHitN)auVar72[0x16];
                        local_180[0x17] = (RTCHitN)auVar72[0x17];
                        local_180[0x18] = (RTCHitN)auVar72[0x18];
                        local_180[0x19] = (RTCHitN)auVar72[0x19];
                        local_180[0x1a] = (RTCHitN)auVar72[0x1a];
                        local_180[0x1b] = (RTCHitN)auVar72[0x1b];
                        local_180[0x1c] = (RTCHitN)auVar72[0x1c];
                        local_180[0x1d] = (RTCHitN)auVar72[0x1d];
                        local_180[0x1e] = (RTCHitN)auVar72[0x1e];
                        local_180[0x1f] = (RTCHitN)auVar72[0x1f];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = local_1e0._0_8_;
                        uStack_d8 = local_1e0._8_8_;
                        uStack_d0 = local_1e0._16_8_;
                        uStack_c8 = local_1e0._24_8_;
                        local_c0 = local_200;
                        vpcmpeqd_avx2(local_200,local_200);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = auVar44._0_4_;
                        local_3e0 = local_220;
                        local_430.valid = (int *)local_3e0;
                        local_430.geometryUserPtr = pGVar8->userPtr;
                        local_430.context = context->user;
                        local_430.ray = (RTCRayN *)ray;
                        local_430.hit = local_180;
                        local_430.N = 8;
                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->occlusionFilterN)(&local_430);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar243 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar240 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar238 = ZEXT1664(auVar43);
                        }
                        if (local_3e0 == (undefined1  [32])0x0) {
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar239 = ZEXT1664(auVar43);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar241 = ZEXT3264(auVar72);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar242 = ZEXT1664(auVar43);
                          auVar244 = ZEXT3264(_DAT_01feed20);
                          auVar43 = vxorps_avx512vl(auVar46,auVar46);
                          auVar246 = ZEXT1664(auVar43);
                          auVar245 = ZEXT3264(local_400);
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if (p_Var9 == (RTCFilterFunctionN)0x0) {
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar239 = ZEXT1664(auVar43);
                            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar241 = ZEXT3264(auVar72);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar242 = ZEXT1664(auVar43);
                            auVar244 = ZEXT3264(_DAT_01feed20);
                            auVar43 = vxorps_avx512vl(auVar46,auVar46);
                            auVar246 = ZEXT1664(auVar43);
                            auVar245 = ZEXT3264(local_400);
                          }
                          else {
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar239 = ZEXT1664(auVar43);
                            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar241 = ZEXT3264(auVar72);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar242 = ZEXT1664(auVar43);
                            auVar244 = ZEXT3264(_DAT_01feed20);
                            auVar43 = vxorps_avx512vl(auVar46,auVar46);
                            auVar246 = ZEXT1664(auVar43);
                            auVar245 = ZEXT3264(local_400);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var9)(&local_430);
                              auVar245 = ZEXT3264(local_400);
                              auVar43 = vxorps_avx512vl(auVar43,auVar43);
                              auVar246 = ZEXT1664(auVar43);
                              auVar244 = ZEXT3264(_DAT_01feed20);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar243 = ZEXT1664(auVar43);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar242 = ZEXT1664(auVar43);
                              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar241 = ZEXT3264(auVar72);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar240 = ZEXT1664(auVar43);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar239 = ZEXT1664(auVar43);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar238 = ZEXT1664(auVar43);
                            }
                          }
                          auVar247 = ZEXT464(0x3f800000);
                          uVar36 = vptestmd_avx512vl(local_3e0,local_3e0);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar41 = (bool)((byte)uVar36 & 1);
                          bVar42 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar39 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar15 = SUB81(uVar36 >> 7,0);
                          *(uint *)(local_430.ray + 0x100) =
                               (uint)bVar41 * auVar72._0_4_ |
                               (uint)!bVar41 * *(int *)(local_430.ray + 0x100);
                          *(uint *)(local_430.ray + 0x104) =
                               (uint)bVar42 * auVar72._4_4_ |
                               (uint)!bVar42 * *(int *)(local_430.ray + 0x104);
                          *(uint *)(local_430.ray + 0x108) =
                               (uint)bVar39 * auVar72._8_4_ |
                               (uint)!bVar39 * *(int *)(local_430.ray + 0x108);
                          *(uint *)(local_430.ray + 0x10c) =
                               (uint)bVar40 * auVar72._12_4_ |
                               (uint)!bVar40 * *(int *)(local_430.ray + 0x10c);
                          *(uint *)(local_430.ray + 0x110) =
                               (uint)bVar12 * auVar72._16_4_ |
                               (uint)!bVar12 * *(int *)(local_430.ray + 0x110);
                          *(uint *)(local_430.ray + 0x114) =
                               (uint)bVar13 * auVar72._20_4_ |
                               (uint)!bVar13 * *(int *)(local_430.ray + 0x114);
                          *(uint *)(local_430.ray + 0x118) =
                               (uint)bVar14 * auVar72._24_4_ |
                               (uint)!bVar14 * *(int *)(local_430.ray + 0x118);
                          *(uint *)(local_430.ray + 0x11c) =
                               (uint)bVar15 * auVar72._28_4_ |
                               (uint)!bVar15 * *(int *)(local_430.ray + 0x11c);
                          bVar32 = 1;
                          if (local_3e0 != (undefined1  [32])0x0) goto LAB_01c9a26f;
                        }
                        auVar247 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x100) = fVar208;
                        bVar32 = 0;
                      }
LAB_01c9a26f:
                      bVar38 = (bool)(bVar38 | bVar32);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar31 = lVar31 + -1;
      } while (lVar31 != 0);
      goto LAB_01c993c4;
    }
    auVar44 = vinsertps_avx(auVar149,auVar56,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }